

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersector1<4>::
     intersect_n<embree::avx512::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  ulong uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  bool bVar23;
  byte bVar24;
  uint uVar25;
  ulong uVar26;
  long lVar28;
  uint uVar29;
  long lVar30;
  ulong uVar31;
  uint uVar32;
  long lVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  int iVar97;
  undefined4 uVar98;
  vint4 bi_2;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  vint4 bi_1;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  vint4 bi;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  vfloat4 a0;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  vint4 ai_2;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  vint4 ai_1;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  vint4 ai;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  float fVar166;
  float fVar175;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar183;
  float fVar197;
  float fVar198;
  float fVar199;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  vfloat4 a0_4;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar208;
  float fVar219;
  float fVar220;
  vfloat4 b0_1;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar221;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar222;
  float fVar223;
  float fVar224;
  __m128 a_3;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  vfloat4 a0_5;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 in_ZMM23 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar258 [64];
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_31c;
  undefined1 local_318 [16];
  ulong local_300;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  long local_268;
  Primitive *local_260;
  RTCFilterFunctionNArguments local_258;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  uint auStack_188 [4];
  undefined8 local_178;
  float local_170;
  undefined8 local_16c;
  uint local_164;
  uint local_160;
  uint local_15c;
  uint local_158;
  undefined1 local_148 [16];
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  undefined8 uStack_b8;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar27;
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar244 [32];
  
  PVar6 = prim[1];
  uVar26 = (ulong)(byte)PVar6;
  lVar33 = uVar26 * 0x25;
  fVar224 = *(float *)(prim + lVar33 + 0x12);
  auVar44 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + lVar33 + 6));
  auVar54._0_4_ = fVar224 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar54._4_4_ = fVar224 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar54._8_4_ = fVar224 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar54._12_4_ = fVar224 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar43 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 4 + 6)));
  auVar130._0_4_ = fVar224 * auVar44._0_4_;
  auVar130._4_4_ = fVar224 * auVar44._4_4_;
  auVar130._8_4_ = fVar224 * auVar44._8_4_;
  auVar130._12_4_ = fVar224 * auVar44._12_4_;
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 5 + 6)));
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 6 + 6)));
  auVar52 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0xf + 6)));
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar52 = vcvtdq2ps_avx(auVar52);
  auVar57 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar26 + 6)));
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar55 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0x1a + 6)));
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar56 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0x1b + 6)));
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar42 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0x1c + 6)));
  auVar42 = vcvtdq2ps_avx(auVar42);
  auVar137._4_4_ = auVar54._0_4_;
  auVar137._0_4_ = auVar54._0_4_;
  auVar137._8_4_ = auVar54._0_4_;
  auVar137._12_4_ = auVar54._0_4_;
  auVar59 = vshufps_avx(auVar54,auVar54,0x55);
  auVar60 = vshufps_avx(auVar54,auVar54,0xaa);
  fVar224 = auVar60._0_4_;
  auVar58._0_4_ = fVar224 * auVar40._0_4_;
  fVar208 = auVar60._4_4_;
  auVar58._4_4_ = fVar208 * auVar40._4_4_;
  fVar219 = auVar60._8_4_;
  auVar58._8_4_ = fVar219 * auVar40._8_4_;
  fVar220 = auVar60._12_4_;
  auVar58._12_4_ = fVar220 * auVar40._12_4_;
  auVar51._0_4_ = auVar41._0_4_ * fVar224;
  auVar51._4_4_ = auVar41._4_4_ * fVar208;
  auVar51._8_4_ = auVar41._8_4_ * fVar219;
  auVar51._12_4_ = auVar41._12_4_ * fVar220;
  auVar46._0_4_ = auVar42._0_4_ * fVar224;
  auVar46._4_4_ = auVar42._4_4_ * fVar208;
  auVar46._8_4_ = auVar42._8_4_ * fVar219;
  auVar46._12_4_ = auVar42._12_4_ * fVar220;
  auVar60 = vfmadd231ps_fma(auVar58,auVar59,auVar44);
  auVar62 = vfmadd231ps_fma(auVar51,auVar59,auVar57);
  auVar59 = vfmadd231ps_fma(auVar46,auVar56,auVar59);
  auVar60 = vfmadd231ps_fma(auVar60,auVar137,auVar43);
  auVar62 = vfmadd231ps_fma(auVar62,auVar137,auVar52);
  auVar61 = vfmadd231ps_fma(auVar59,auVar55,auVar137);
  auVar238._4_4_ = auVar130._0_4_;
  auVar238._0_4_ = auVar130._0_4_;
  auVar238._8_4_ = auVar130._0_4_;
  auVar238._12_4_ = auVar130._0_4_;
  auVar59 = vshufps_avx(auVar130,auVar130,0x55);
  auVar83._16_16_ = in_YmmResult._16_16_;
  auVar39 = vshufps_avx512vl(auVar130,auVar130,0xaa);
  auVar40 = vmulps_avx512vl(auVar39,auVar40);
  auVar41 = vmulps_avx512vl(auVar39,auVar41);
  auVar42 = vmulps_avx512vl(auVar39,auVar42);
  auVar44 = vfmadd231ps_fma(auVar40,auVar59,auVar44);
  auVar40 = vfmadd231ps_fma(auVar41,auVar59,auVar57);
  auVar57 = vfmadd231ps_fma(auVar42,auVar59,auVar56);
  auVar45 = vfmadd231ps_fma(auVar44,auVar238,auVar43);
  auVar46 = vfmadd231ps_fma(auVar40,auVar238,auVar52);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar255 = ZEXT1664(auVar43);
  auVar47 = vfmadd231ps_fma(auVar57,auVar238,auVar55);
  auVar44 = vandps_avx512vl(auVar60,auVar43);
  auVar167._8_4_ = 0x219392ef;
  auVar167._0_8_ = 0x219392ef219392ef;
  auVar167._12_4_ = 0x219392ef;
  uVar38 = vcmpps_avx512vl(auVar44,auVar167,1);
  bVar36 = (bool)((byte)uVar38 & 1);
  auVar48._0_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar60._0_4_;
  bVar36 = (bool)((byte)(uVar38 >> 1) & 1);
  auVar48._4_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar60._4_4_;
  bVar36 = (bool)((byte)(uVar38 >> 2) & 1);
  auVar48._8_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar60._8_4_;
  bVar36 = (bool)((byte)(uVar38 >> 3) & 1);
  auVar48._12_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar60._12_4_;
  auVar44 = vandps_avx512vl(auVar62,auVar43);
  uVar38 = vcmpps_avx512vl(auVar44,auVar167,1);
  bVar36 = (bool)((byte)uVar38 & 1);
  auVar49._0_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar62._0_4_;
  bVar36 = (bool)((byte)(uVar38 >> 1) & 1);
  auVar49._4_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar62._4_4_;
  bVar36 = (bool)((byte)(uVar38 >> 2) & 1);
  auVar49._8_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar62._8_4_;
  bVar36 = (bool)((byte)(uVar38 >> 3) & 1);
  auVar49._12_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar62._12_4_;
  auVar43 = vandps_avx512vl(auVar61,auVar43);
  uVar38 = vcmpps_avx512vl(auVar43,auVar167,1);
  bVar36 = (bool)((byte)uVar38 & 1);
  auVar50._0_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar61._0_4_;
  bVar36 = (bool)((byte)(uVar38 >> 1) & 1);
  auVar50._4_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar61._4_4_;
  bVar36 = (bool)((byte)(uVar38 >> 2) & 1);
  auVar50._8_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar61._8_4_;
  bVar36 = (bool)((byte)(uVar38 >> 3) & 1);
  auVar50._12_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar61._12_4_;
  auVar43 = vrcp14ps_avx512vl(auVar48);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar256 = ZEXT1664(auVar44);
  auVar40 = vfnmadd213ps_avx512vl(auVar48,auVar43,auVar44);
  auVar61 = vfmadd132ps_fma(auVar40,auVar43,auVar43);
  auVar43 = vrcp14ps_avx512vl(auVar49);
  auVar40 = vfnmadd213ps_avx512vl(auVar49,auVar43,auVar44);
  auVar39 = vfmadd132ps_fma(auVar40,auVar43,auVar43);
  auVar43 = vrcp14ps_avx512vl(auVar50);
  auVar44 = vfnmadd213ps_avx512vl(auVar50,auVar43,auVar44);
  auVar63 = vfmadd132ps_fma(auVar44,auVar43,auVar43);
  fVar224 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar33 + 0x16)) *
            *(float *)(prim + lVar33 + 0x1a);
  auVar153._4_4_ = fVar224;
  auVar153._0_4_ = fVar224;
  auVar153._8_4_ = fVar224;
  auVar153._12_4_ = fVar224;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar26 * 7 + 6);
  auVar43 = vpmovsxwd_avx(auVar43);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar26 * 0xb + 6);
  auVar44 = vpmovsxwd_avx(auVar44);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar52 = vsubps_avx(auVar44,auVar43);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar26 * 9 + 6);
  auVar44 = vpmovsxwd_avx(auVar40);
  auVar40 = vfmadd213ps_fma(auVar52,auVar153,auVar43);
  auVar43 = vcvtdq2ps_avx(auVar44);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar26 * 0xd + 6);
  auVar44 = vpmovsxwd_avx(auVar52);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar44 = vsubps_avx(auVar44,auVar43);
  auVar52 = vfmadd213ps_fma(auVar44,auVar153,auVar43);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar26 * 0x12 + 6);
  auVar43 = vpmovsxwd_avx(auVar57);
  auVar43 = vcvtdq2ps_avx(auVar43);
  uVar38 = (ulong)(uint)((int)(uVar26 * 5) << 2);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar26 * 2 + uVar38 + 6);
  auVar44 = vpmovsxwd_avx(auVar41);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar44 = vsubps_avx(auVar44,auVar43);
  auVar57 = vfmadd213ps_fma(auVar44,auVar153,auVar43);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar38 + 6);
  auVar43 = vpmovsxwd_avx(auVar55);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar26 * 0x18 + 6);
  auVar44 = vpmovsxwd_avx(auVar56);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar44 = vsubps_avx(auVar44,auVar43);
  auVar41 = vfmadd213ps_fma(auVar44,auVar153,auVar43);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar26 * 0x1d + 6);
  auVar43 = vpmovsxwd_avx(auVar42);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar26 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar44 = vpmovsxwd_avx(auVar59);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar44 = vsubps_avx(auVar44,auVar43);
  auVar55 = vfmadd213ps_fma(auVar44,auVar153,auVar43);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar26) + 6);
  auVar43 = vpmovsxwd_avx(auVar60);
  auVar43 = vcvtdq2ps_avx(auVar43);
  local_260 = prim;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *(ulong *)(prim + uVar26 * 0x23 + 6);
  auVar44 = vpmovsxwd_avx(auVar62);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar44 = vsubps_avx(auVar44,auVar43);
  auVar44 = vfmadd213ps_fma(auVar44,auVar153,auVar43);
  auVar43 = vsubps_avx(auVar40,auVar45);
  auVar154._0_4_ = auVar61._0_4_ * auVar43._0_4_;
  auVar154._4_4_ = auVar61._4_4_ * auVar43._4_4_;
  auVar154._8_4_ = auVar61._8_4_ * auVar43._8_4_;
  auVar154._12_4_ = auVar61._12_4_ * auVar43._12_4_;
  auVar43 = vsubps_avx(auVar52,auVar45);
  auVar116._0_4_ = auVar61._0_4_ * auVar43._0_4_;
  auVar116._4_4_ = auVar61._4_4_ * auVar43._4_4_;
  auVar116._8_4_ = auVar61._8_4_ * auVar43._8_4_;
  auVar116._12_4_ = auVar61._12_4_ * auVar43._12_4_;
  auVar43 = vsubps_avx(auVar57,auVar46);
  auVar138._0_4_ = auVar39._0_4_ * auVar43._0_4_;
  auVar138._4_4_ = auVar39._4_4_ * auVar43._4_4_;
  auVar138._8_4_ = auVar39._8_4_ * auVar43._8_4_;
  auVar138._12_4_ = auVar39._12_4_ * auVar43._12_4_;
  auVar43 = vsubps_avx(auVar41,auVar46);
  auVar53._0_4_ = auVar39._0_4_ * auVar43._0_4_;
  auVar53._4_4_ = auVar39._4_4_ * auVar43._4_4_;
  auVar53._8_4_ = auVar39._8_4_ * auVar43._8_4_;
  auVar53._12_4_ = auVar39._12_4_ * auVar43._12_4_;
  auVar43 = vsubps_avx(auVar55,auVar47);
  auVar131._0_4_ = auVar63._0_4_ * auVar43._0_4_;
  auVar131._4_4_ = auVar63._4_4_ * auVar43._4_4_;
  auVar131._8_4_ = auVar63._8_4_ * auVar43._8_4_;
  auVar131._12_4_ = auVar63._12_4_ * auVar43._12_4_;
  auVar43 = vsubps_avx(auVar44,auVar47);
  auVar47._0_4_ = auVar63._0_4_ * auVar43._0_4_;
  auVar47._4_4_ = auVar63._4_4_ * auVar43._4_4_;
  auVar47._8_4_ = auVar63._8_4_ * auVar43._8_4_;
  auVar47._12_4_ = auVar63._12_4_ * auVar43._12_4_;
  auVar43 = vpminsd_avx(auVar154,auVar116);
  auVar44 = vpminsd_avx(auVar138,auVar53);
  auVar43 = vmaxps_avx(auVar43,auVar44);
  auVar44 = vpminsd_avx(auVar131,auVar47);
  uVar98 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar61._4_4_ = uVar98;
  auVar61._0_4_ = uVar98;
  auVar61._8_4_ = uVar98;
  auVar61._12_4_ = uVar98;
  auVar44 = vmaxps_avx512vl(auVar44,auVar61);
  auVar43 = vmaxps_avx(auVar43,auVar44);
  auVar39._8_4_ = 0x3f7ffffa;
  auVar39._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar39._12_4_ = 0x3f7ffffa;
  local_148 = vmulps_avx512vl(auVar43,auVar39);
  auVar43 = vpmaxsd_avx(auVar154,auVar116);
  auVar44 = vpmaxsd_avx(auVar138,auVar53);
  auVar43 = vminps_avx(auVar43,auVar44);
  auVar44 = vpmaxsd_avx(auVar131,auVar47);
  fVar224 = (ray->super_RayK<1>).tfar;
  auVar63._4_4_ = fVar224;
  auVar63._0_4_ = fVar224;
  auVar63._8_4_ = fVar224;
  auVar63._12_4_ = fVar224;
  auVar44 = vminps_avx512vl(auVar44,auVar63);
  auVar43 = vminps_avx(auVar43,auVar44);
  auVar45._8_4_ = 0x3f800003;
  auVar45._0_8_ = 0x3f8000033f800003;
  auVar45._12_4_ = 0x3f800003;
  auVar43 = vmulps_avx512vl(auVar43,auVar45);
  auVar44 = vpbroadcastd_avx512vl();
  uVar14 = vcmpps_avx512vl(local_148,auVar43,2);
  uVar38 = vpcmpgtd_avx512vl(auVar44,_DAT_01f7fcf0);
  uVar38 = ((byte)uVar14 & 0xf) & uVar38;
  if ((char)uVar38 == '\0') {
    return;
  }
  auVar43 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar258 = ZEXT1664(auVar43);
  auVar83._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar254 = ZEXT1664(auVar83._0_16_);
LAB_01bbfacb:
  lVar33 = 0;
  for (uVar26 = uVar38; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
    lVar33 = lVar33 + 1;
  }
  uVar32 = *(uint *)(local_260 + 2);
  pGVar8 = (context->scene->geometries).items[uVar32].ptr;
  fVar224 = (pGVar8->time_range).lower;
  fVar219 = pGVar8->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar224) /
            ((pGVar8->time_range).upper - fVar224));
  auVar43 = vroundss_avx(ZEXT416((uint)fVar219),ZEXT416((uint)fVar219),9);
  auVar79._16_16_ = auVar83._16_16_;
  auVar44 = vaddss_avx512f(ZEXT416((uint)pGVar8->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar43 = vminss_avx(auVar43,auVar44);
  auVar45 = vmaxss_avx512f(auVar258._0_16_,auVar43);
  local_300 = (ulong)*(uint *)(local_260 + lVar33 * 4 + 6);
  uVar26 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)*(uint *)(local_260 + lVar33 * 4 + 6) *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar30 = (long)(int)auVar45._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar30);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar30);
  auVar43 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar26);
  lVar33 = uVar26 + 1;
  auVar44 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar33);
  lVar28 = uVar26 + 2;
  auVar40 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar28);
  lVar1 = uVar26 + 3;
  auVar52 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar30);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar30);
  auVar57 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar26);
  auVar41 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar33);
  auVar55 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar28);
  auVar56 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar30);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar30);
  auVar42 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar26);
  auVar59 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar33);
  auVar60 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar28);
  auVar62 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  lVar11 = *(long *)(lVar10 + 0x38 + lVar30);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar30);
  auVar61 = *(undefined1 (*) [16])(lVar11 + uVar26 * lVar10);
  auVar39 = *(undefined1 (*) [16])(lVar11 + lVar33 * lVar10);
  auVar63 = *(undefined1 (*) [16])(lVar11 + lVar28 * lVar10);
  fVar219 = fVar219 - auVar45._0_4_;
  auVar79._0_16_ = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
  auVar45 = vmulps_avx512vl(auVar52,auVar79._0_16_);
  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaab));
  auVar47 = vfmadd213ps_avx512vl(auVar46,auVar40,auVar45);
  auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar47 = vfmadd231ps_avx512vl(auVar47,auVar44,auVar48);
  auVar47 = vfmadd231ps_avx512vl(auVar47,auVar43,auVar46);
  auVar116 = auVar254._0_16_;
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar40,auVar116);
  auVar45 = vfnmadd231ps_avx512vl(auVar45,auVar44,auVar79._0_16_);
  auVar45 = vfnmadd231ps_avx512vl(auVar45,auVar43,auVar116);
  auVar49 = vmulps_avx512vl(auVar56,auVar79._0_16_);
  auVar50 = vfmadd213ps_avx512vl(auVar46,auVar55,auVar49);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar41,auVar48);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar57,auVar46);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar55,auVar116);
  auVar49 = vfnmadd231ps_avx512vl(auVar49,auVar41,auVar79._0_16_);
  auVar49 = vfnmadd231ps_avx512vl(auVar49,auVar57,auVar116);
  auVar51 = vmulps_avx512vl(auVar52,auVar46);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar40,auVar48);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar44,auVar46);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar43,auVar79._0_16_);
  auVar52 = vmulps_avx512vl(auVar52,auVar116);
  auVar40 = vfmadd231ps_avx512vl(auVar52,auVar79._0_16_,auVar40);
  auVar44 = vfnmadd231ps_avx512vl(auVar40,auVar116,auVar44);
  auVar53 = vfnmadd231ps_avx512vl(auVar44,auVar79._0_16_,auVar43);
  auVar43 = vmulps_avx512vl(auVar56,auVar46);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar55,auVar48);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar41,auVar46);
  auVar54 = vfmadd231ps_avx512vl(auVar43,auVar57,auVar79._0_16_);
  auVar43 = vmulps_avx512vl(auVar56,auVar116);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar79._0_16_,auVar55);
  auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar116,auVar41);
  auVar41 = vfnmadd231ps_avx512vl(auVar43,auVar79._0_16_,auVar57);
  auVar44 = vshufps_avx512vl(auVar45,auVar45,0xc9);
  auVar43 = vshufps_avx512vl(auVar50,auVar50,0xc9);
  auVar43 = vmulps_avx512vl(auVar45,auVar43);
  auVar43 = vfmsub231ps_avx512vl(auVar43,auVar44,auVar50);
  auVar40 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar43 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar43 = vmulps_avx512vl(auVar45,auVar43);
  auVar43 = vfmsub231ps_fma(auVar43,auVar44,auVar49);
  auVar52 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar43 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar44 = vshufps_avx(auVar54,auVar54,0xc9);
  fVar222 = auVar53._0_4_;
  auVar155._0_4_ = fVar222 * auVar44._0_4_;
  fVar223 = auVar53._4_4_;
  auVar155._4_4_ = fVar223 * auVar44._4_4_;
  fVar166 = auVar53._8_4_;
  auVar155._8_4_ = fVar166 * auVar44._8_4_;
  fVar175 = auVar53._12_4_;
  auVar155._12_4_ = fVar175 * auVar44._12_4_;
  auVar44 = vfmsub231ps_fma(auVar155,auVar43,auVar54);
  auVar57 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar156._0_4_ = fVar222 * auVar44._0_4_;
  auVar156._4_4_ = fVar223 * auVar44._4_4_;
  auVar156._8_4_ = fVar166 * auVar44._8_4_;
  auVar156._12_4_ = fVar175 * auVar44._12_4_;
  auVar44 = vfmsub231ps_fma(auVar156,auVar43,auVar41);
  auVar43 = vdpps_avx(auVar40,auVar40,0x7f);
  auVar41 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar64._4_28_ = auVar79._4_28_;
  auVar64._0_4_ = auVar43._0_4_;
  auVar44 = vrsqrt14ss_avx512f(auVar79._0_16_,auVar64._0_16_);
  auVar55 = vmulss_avx512f(auVar44,ZEXT416(0x3fc00000));
  auVar56 = vmulss_avx512f(auVar43,ZEXT416(0xbf000000));
  auVar56 = vmulss_avx512f(auVar56,auVar44);
  auVar56 = vmulss_avx512f(auVar56,ZEXT416((uint)(auVar44._0_4_ * auVar44._0_4_)));
  auVar44 = vdpps_avx(auVar40,auVar52,0x7f);
  fVar224 = auVar55._0_4_ + auVar56._0_4_;
  fVar183 = fVar224 * auVar40._0_4_;
  fVar197 = fVar224 * auVar40._4_4_;
  fVar198 = fVar224 * auVar40._8_4_;
  fVar199 = fVar224 * auVar40._12_4_;
  auVar55 = vbroadcastss_avx512vl(auVar43);
  auVar52 = vmulps_avx512vl(auVar55,auVar52);
  fVar208 = auVar44._0_4_;
  auVar99._0_4_ = fVar208 * auVar40._0_4_;
  auVar99._4_4_ = fVar208 * auVar40._4_4_;
  auVar99._8_4_ = fVar208 * auVar40._8_4_;
  auVar99._12_4_ = fVar208 * auVar40._12_4_;
  auVar40 = vsubps_avx(auVar52,auVar99);
  auVar44 = vrcp14ss_avx512f(auVar79._0_16_,auVar64._0_16_);
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar44,ZEXT416(0x40000000));
  fVar220 = auVar44._0_4_ * auVar43._0_4_;
  auVar43 = vdpps_avx(auVar57,auVar57,0x7f);
  auVar82._16_16_ = auVar79._16_16_;
  auVar82._0_16_ = auVar79._0_16_;
  auVar65._4_28_ = auVar82._4_28_;
  auVar65._0_4_ = auVar43._0_4_;
  auVar44 = vrsqrt14ss_avx512f(auVar79._0_16_,auVar65._0_16_);
  auVar52 = vmulss_avx512f(auVar44,ZEXT416(0x3fc00000));
  auVar55 = vmulss_avx512f(auVar43,ZEXT416(0xbf000000));
  fVar208 = auVar44._0_4_;
  fVar208 = auVar52._0_4_ + auVar55._0_4_ * fVar208 * fVar208 * fVar208;
  auVar44 = vdpps_avx(auVar57,auVar41,0x7f);
  auVar176._0_4_ = auVar57._0_4_ * fVar208;
  auVar176._4_4_ = auVar57._4_4_ * fVar208;
  auVar176._8_4_ = auVar57._8_4_ * fVar208;
  auVar176._12_4_ = auVar57._12_4_ * fVar208;
  auVar52 = vbroadcastss_avx512vl(auVar43);
  auVar52 = vmulps_avx512vl(auVar52,auVar41);
  fVar221 = auVar44._0_4_;
  auVar111._0_4_ = fVar221 * auVar57._0_4_;
  auVar111._4_4_ = fVar221 * auVar57._4_4_;
  auVar111._8_4_ = fVar221 * auVar57._8_4_;
  auVar111._12_4_ = fVar221 * auVar57._12_4_;
  auVar44 = vsubps_avx(auVar52,auVar111);
  auVar52 = vrcp14ss_avx512f(auVar79._0_16_,auVar65._0_16_);
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar52,ZEXT416(0x40000000));
  fVar221 = auVar52._0_4_ * auVar43._0_4_;
  auVar43 = vshufps_avx512vl(auVar47,auVar47,0xff);
  auVar132._0_4_ = fVar183 * auVar43._0_4_;
  auVar132._4_4_ = fVar197 * auVar43._4_4_;
  auVar132._8_4_ = fVar198 * auVar43._8_4_;
  auVar132._12_4_ = fVar199 * auVar43._12_4_;
  auVar49 = vsubps_avx512vl(auVar47,auVar132);
  auVar52 = vshufps_avx512vl(auVar45,auVar45,0xff);
  auVar100._0_4_ = fVar183 * auVar52._0_4_ + auVar43._0_4_ * fVar224 * fVar220 * auVar40._0_4_;
  auVar100._4_4_ = fVar197 * auVar52._4_4_ + auVar43._4_4_ * fVar224 * fVar220 * auVar40._4_4_;
  auVar100._8_4_ = fVar198 * auVar52._8_4_ + auVar43._8_4_ * fVar224 * fVar220 * auVar40._8_4_;
  auVar100._12_4_ = fVar199 * auVar52._12_4_ + auVar43._12_4_ * fVar224 * fVar220 * auVar40._12_4_;
  auVar40 = vsubps_avx512vl(auVar45,auVar100);
  auVar47 = vaddps_avx512vl(auVar47,auVar132);
  auVar52 = vaddps_avx512vl(auVar45,auVar100);
  auVar43 = vshufps_avx512vl(auVar51,auVar51,0xff);
  auVar184._0_4_ = auVar176._0_4_ * auVar43._0_4_;
  auVar184._4_4_ = auVar176._4_4_ * auVar43._4_4_;
  auVar184._8_4_ = auVar176._8_4_ * auVar43._8_4_;
  auVar184._12_4_ = auVar176._12_4_ * auVar43._12_4_;
  auVar45 = vsubps_avx512vl(auVar51,auVar184);
  auVar57 = vshufps_avx512vl(auVar53,auVar53,0xff);
  auVar57 = vmulps_avx512vl(auVar57,auVar176);
  auVar157._0_4_ = auVar57._0_4_ + auVar43._0_4_ * fVar208 * auVar44._0_4_ * fVar221;
  auVar157._4_4_ = auVar57._4_4_ + auVar43._4_4_ * fVar208 * auVar44._4_4_ * fVar221;
  auVar157._8_4_ = auVar57._8_4_ + auVar43._8_4_ * fVar208 * auVar44._8_4_ * fVar221;
  auVar157._12_4_ = auVar57._12_4_ + auVar43._12_4_ * fVar208 * auVar44._12_4_ * fVar221;
  auVar43 = vsubps_avx(auVar53,auVar157);
  auVar50 = vaddps_avx512vl(auVar51,auVar184);
  auVar168._0_4_ = auVar49._0_4_ + auVar40._0_4_ * 0.33333334;
  auVar168._4_4_ = auVar49._4_4_ + auVar40._4_4_ * 0.33333334;
  auVar168._8_4_ = auVar49._8_4_ + auVar40._8_4_ * 0.33333334;
  auVar168._12_4_ = auVar49._12_4_ + auVar40._12_4_ * 0.33333334;
  auVar139._0_4_ = auVar43._0_4_ * 0.33333334;
  auVar139._4_4_ = auVar43._4_4_ * 0.33333334;
  auVar139._8_4_ = auVar43._8_4_ * 0.33333334;
  auVar139._12_4_ = auVar43._12_4_ * 0.33333334;
  auVar55 = vsubps_avx(auVar45,auVar139);
  auVar101._0_4_ = auVar52._0_4_ * 0.33333334;
  auVar101._4_4_ = auVar52._4_4_ * 0.33333334;
  auVar101._8_4_ = auVar52._8_4_ * 0.33333334;
  auVar101._12_4_ = auVar52._12_4_ * 0.33333334;
  auVar51 = vaddps_avx512vl(auVar47,auVar101);
  auVar102._0_4_ = (fVar222 + auVar157._0_4_) * 0.33333334;
  auVar102._4_4_ = (fVar223 + auVar157._4_4_) * 0.33333334;
  auVar102._8_4_ = (fVar166 + auVar157._8_4_) * 0.33333334;
  auVar102._12_4_ = (fVar175 + auVar157._12_4_) * 0.33333334;
  auVar43 = *(undefined1 (*) [16])(lVar11 + lVar10 * lVar1);
  auVar56 = vsubps_avx(auVar50,auVar102);
  auVar44 = vmulps_avx512vl(auVar62,auVar79._0_16_);
  auVar40 = vfmadd213ps_avx512vl(auVar46,auVar60,auVar44);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar59,auVar48);
  auVar53 = vfmadd231ps_avx512vl(auVar40,auVar42,auVar46);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar60,auVar116);
  auVar44 = vfnmadd231ps_avx512vl(auVar44,auVar59,auVar79._0_16_);
  auVar54 = vfnmadd231ps_avx512vl(auVar44,auVar42,auVar116);
  auVar44 = vmulps_avx512vl(auVar43,auVar79._0_16_);
  auVar40 = vfmadd213ps_avx512vl(auVar46,auVar63,auVar44);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar39,auVar48);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar61,auVar46);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar63,auVar116);
  auVar44 = vfnmadd231ps_avx512vl(auVar44,auVar39,auVar79._0_16_);
  auVar52 = vfnmadd231ps_avx512vl(auVar44,auVar61,auVar116);
  auVar44 = vmulps_avx512vl(auVar62,auVar46);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar60,auVar48);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar59,auVar46);
  auVar58 = vfmadd231ps_avx512vl(auVar44,auVar42,auVar79._0_16_);
  auVar44 = vmulps_avx512vl(auVar62,auVar116);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar79._0_16_,auVar60);
  auVar44 = vfnmadd231ps_avx512vl(auVar44,auVar116,auVar59);
  auVar42 = vfnmadd231ps_avx512vl(auVar44,auVar79._0_16_,auVar42);
  auVar44 = vmulps_avx512vl(auVar43,auVar46);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar63,auVar48);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar39,auVar46);
  auVar57 = vfmadd231ps_avx512vl(auVar44,auVar61,auVar79._0_16_);
  auVar43 = vmulps_avx512vl(auVar43,auVar116);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar79._0_16_,auVar63);
  auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar116,auVar39);
  auVar41 = vfnmadd231ps_avx512vl(auVar43,auVar79._0_16_,auVar61);
  auVar43 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar44 = vshufps_avx512vl(auVar40,auVar40,0xc9);
  fVar221 = auVar54._0_4_;
  auVar225._0_4_ = fVar221 * auVar44._0_4_;
  fVar222 = auVar54._4_4_;
  auVar225._4_4_ = fVar222 * auVar44._4_4_;
  fVar223 = auVar54._8_4_;
  auVar225._8_4_ = fVar223 * auVar44._8_4_;
  fVar166 = auVar54._12_4_;
  auVar225._12_4_ = fVar166 * auVar44._12_4_;
  auVar44 = vfmsub231ps_avx512vl(auVar225,auVar43,auVar40);
  auVar40 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar232._0_4_ = fVar221 * auVar44._0_4_;
  auVar232._4_4_ = fVar222 * auVar44._4_4_;
  auVar232._8_4_ = fVar223 * auVar44._8_4_;
  auVar232._12_4_ = fVar166 * auVar44._12_4_;
  auVar43 = vfmsub231ps_fma(auVar232,auVar43,auVar52);
  auVar52 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar44 = vshufps_avx512vl(auVar42,auVar42,0xc9);
  auVar43 = vshufps_avx(auVar57,auVar57,0xc9);
  auVar43 = vmulps_avx512vl(auVar42,auVar43);
  auVar43 = vfmsub231ps_fma(auVar43,auVar44,auVar57);
  auVar57 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar43 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar43 = vmulps_avx512vl(auVar42,auVar43);
  auVar43 = vfmsub231ps_fma(auVar43,auVar44,auVar41);
  auVar41 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar43 = vdpps_avx(auVar40,auVar40,0x7f);
  auVar66._16_16_ = auVar79._16_16_;
  auVar66._0_16_ = auVar79._0_16_;
  auVar67._4_28_ = auVar66._4_28_;
  auVar67._0_4_ = auVar43._0_4_;
  auVar44 = vrsqrt14ss_avx512f(auVar79._0_16_,auVar67._0_16_);
  auVar59 = vmulss_avx512f(auVar44,ZEXT416(0x3fc00000));
  auVar60 = vmulss_avx512f(auVar43,ZEXT416(0xbf000000));
  auVar60 = vmulss_avx512f(auVar60,auVar44);
  auVar44 = vmulss_avx512f(auVar60,ZEXT416((uint)(auVar44._0_4_ * auVar44._0_4_)));
  auVar44 = vaddss_avx512f(auVar59,auVar44);
  auVar245._0_4_ = auVar44._0_4_;
  auVar245._4_4_ = auVar245._0_4_;
  auVar245._8_4_ = auVar245._0_4_;
  auVar245._12_4_ = auVar245._0_4_;
  auVar44 = vdpps_avx(auVar40,auVar52,0x7f);
  auVar59 = vmulps_avx512vl(auVar40,auVar245);
  auVar60 = vbroadcastss_avx512vl(auVar43);
  auVar52 = vmulps_avx512vl(auVar60,auVar52);
  fVar224 = auVar44._0_4_;
  auVar140._0_4_ = auVar40._0_4_ * fVar224;
  auVar140._4_4_ = auVar40._4_4_ * fVar224;
  auVar140._8_4_ = auVar40._8_4_ * fVar224;
  auVar140._12_4_ = auVar40._12_4_ * fVar224;
  auVar40 = vsubps_avx(auVar52,auVar140);
  auVar44 = vrcp14ss_avx512f(auVar79._0_16_,auVar67._0_16_);
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar44,ZEXT416(0x40000000));
  fVar208 = auVar43._0_4_ * auVar44._0_4_;
  auVar43 = vdpps_avx(auVar57,auVar57,0x7f);
  auVar68._16_16_ = auVar79._16_16_;
  auVar68._0_16_ = auVar79._0_16_;
  auVar69._4_28_ = auVar68._4_28_;
  auVar69._0_4_ = auVar43._0_4_;
  auVar44 = vrsqrt14ss_avx512f(auVar79._0_16_,auVar69._0_16_);
  auVar52 = vmulss_avx512f(auVar44,ZEXT416(0x3fc00000));
  auVar257 = ZEXT464(0x3f800000);
  auVar60 = vmulss_avx512f(auVar43,ZEXT416(0xbf000000));
  fVar224 = auVar44._0_4_;
  fVar224 = auVar52._0_4_ + auVar60._0_4_ * fVar224 * fVar224 * fVar224;
  auVar239._0_4_ = auVar57._0_4_ * fVar224;
  auVar239._4_4_ = auVar57._4_4_ * fVar224;
  auVar239._8_4_ = auVar57._8_4_ * fVar224;
  auVar239._12_4_ = auVar57._12_4_ * fVar224;
  auVar44 = vdpps_avx(auVar57,auVar41,0x7f);
  auVar52 = vbroadcastss_avx512vl(auVar43);
  auVar52 = vmulps_avx512vl(auVar52,auVar41);
  fVar220 = auVar44._0_4_;
  auVar200._0_4_ = fVar220 * auVar57._0_4_;
  auVar200._4_4_ = fVar220 * auVar57._4_4_;
  auVar200._8_4_ = fVar220 * auVar57._8_4_;
  auVar200._12_4_ = fVar220 * auVar57._12_4_;
  auVar44 = vsubps_avx(auVar52,auVar200);
  auVar52 = vrcp14ss_avx512f(auVar79._0_16_,auVar69._0_16_);
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar52,ZEXT416(0x40000000));
  fVar220 = auVar52._0_4_ * auVar43._0_4_;
  auVar52 = vshufps_avx512vl(auVar53,auVar53,0xff);
  auVar57 = vmulps_avx512vl(auVar52,auVar59);
  auVar41 = vsubps_avx512vl(auVar53,auVar57);
  auVar43 = vshufps_avx(auVar54,auVar54,0xff);
  auVar43 = vmulps_avx512vl(auVar43,auVar59);
  auVar103._0_4_ = auVar43._0_4_ + auVar52._0_4_ * auVar245._0_4_ * fVar208 * auVar40._0_4_;
  auVar103._4_4_ = auVar43._4_4_ + auVar52._4_4_ * auVar245._0_4_ * fVar208 * auVar40._4_4_;
  auVar103._8_4_ = auVar43._8_4_ + auVar52._8_4_ * auVar245._0_4_ * fVar208 * auVar40._8_4_;
  auVar103._12_4_ = auVar43._12_4_ + auVar52._12_4_ * auVar245._0_4_ * fVar208 * auVar40._12_4_;
  auVar43 = vsubps_avx(auVar54,auVar103);
  auVar40 = vaddps_avx512vl(auVar53,auVar57);
  auVar52 = vshufps_avx512vl(auVar58,auVar58,0xff);
  auVar233._0_4_ = auVar52._0_4_ * auVar239._0_4_;
  auVar233._4_4_ = auVar52._4_4_ * auVar239._4_4_;
  auVar233._8_4_ = auVar52._8_4_ * auVar239._8_4_;
  auVar233._12_4_ = auVar52._12_4_ * auVar239._12_4_;
  auVar57 = vsubps_avx512vl(auVar58,auVar233);
  auVar59 = vshufps_avx512vl(auVar42,auVar42,0xff);
  auVar59 = vmulps_avx512vl(auVar59,auVar239);
  auVar141._0_4_ = auVar59._0_4_ + auVar52._0_4_ * fVar224 * auVar44._0_4_ * fVar220;
  auVar141._4_4_ = auVar59._4_4_ + auVar52._4_4_ * fVar224 * auVar44._4_4_ * fVar220;
  auVar141._8_4_ = auVar59._8_4_ + auVar52._8_4_ * fVar224 * auVar44._8_4_ * fVar220;
  auVar141._12_4_ = auVar59._12_4_ + auVar52._12_4_ * fVar224 * auVar44._12_4_ * fVar220;
  auVar44 = vsubps_avx512vl(auVar42,auVar141);
  auVar52 = vaddps_avx512vl(auVar58,auVar233);
  auVar42 = vaddps_avx512vl(auVar42,auVar141);
  auVar201._0_4_ = auVar41._0_4_ + auVar43._0_4_ * 0.33333334;
  auVar201._4_4_ = auVar41._4_4_ + auVar43._4_4_ * 0.33333334;
  auVar201._8_4_ = auVar41._8_4_ + auVar43._8_4_ * 0.33333334;
  auVar201._12_4_ = auVar41._12_4_ + auVar43._12_4_ * 0.33333334;
  auVar185._0_4_ = auVar44._0_4_ * 0.33333334;
  auVar185._4_4_ = auVar44._4_4_ * 0.33333334;
  auVar185._8_4_ = auVar44._8_4_ * 0.33333334;
  auVar185._12_4_ = auVar44._12_4_ * 0.33333334;
  auVar43 = vsubps_avx(auVar57,auVar185);
  auVar104._0_4_ = auVar40._0_4_ + (fVar221 + auVar103._0_4_) * 0.33333334;
  auVar104._4_4_ = auVar40._4_4_ + (fVar222 + auVar103._4_4_) * 0.33333334;
  auVar104._8_4_ = auVar40._8_4_ + (fVar223 + auVar103._8_4_) * 0.33333334;
  auVar104._12_4_ = auVar40._12_4_ + (fVar166 + auVar103._12_4_) * 0.33333334;
  auVar142._0_4_ = auVar42._0_4_ * 0.33333334;
  auVar142._4_4_ = auVar42._4_4_ * 0.33333334;
  auVar142._8_4_ = auVar42._8_4_ * 0.33333334;
  auVar142._12_4_ = auVar42._12_4_ * 0.33333334;
  auVar44 = vsubps_avx(auVar52,auVar142);
  auVar240._4_4_ = fVar219;
  auVar240._0_4_ = fVar219;
  auVar240._8_4_ = fVar219;
  auVar240._12_4_ = fVar219;
  auVar42 = vsubss_avx512f(ZEXT416(0x3f800000),ZEXT416((uint)fVar219));
  auVar42 = vbroadcastss_avx512vl(auVar42);
  auVar41 = vmulps_avx512vl(auVar240,auVar41);
  auVar59 = vmulps_avx512vl(auVar240,auVar201);
  auVar43 = vmulps_avx512vl(auVar240,auVar43);
  auVar246._0_4_ = fVar219 * auVar57._0_4_;
  auVar246._4_4_ = fVar219 * auVar57._4_4_;
  auVar246._8_4_ = fVar219 * auVar57._8_4_;
  auVar246._12_4_ = fVar219 * auVar57._12_4_;
  local_1b8 = vfmadd231ps_avx512vl(auVar41,auVar42,auVar49);
  local_1c8 = vfmadd231ps_avx512vl(auVar59,auVar42,auVar168);
  local_1d8 = vfmadd231ps_avx512vl(auVar43,auVar42,auVar55);
  local_1e8 = vfmadd231ps_avx512vl(auVar246,auVar42,auVar45);
  auVar43 = vmulps_avx512vl(auVar240,auVar40);
  auVar40 = vmulps_avx512vl(auVar240,auVar104);
  auVar44 = vmulps_avx512vl(auVar240,auVar44);
  auVar234._0_4_ = fVar219 * auVar52._0_4_;
  auVar234._4_4_ = fVar219 * auVar52._4_4_;
  auVar234._8_4_ = fVar219 * auVar52._8_4_;
  auVar234._12_4_ = fVar219 * auVar52._12_4_;
  _local_1f8 = vfmadd231ps_avx512vl(auVar43,auVar42,auVar47);
  _local_208 = vfmadd231ps_avx512vl(auVar40,auVar42,auVar51);
  _local_218 = vfmadd231ps_avx512vl(auVar44,auVar42,auVar56);
  _local_228 = vfmadd231ps_avx512vl(auVar234,auVar42,auVar50);
  aVar3 = (ray->super_RayK<1>).org.field_0;
  auVar44 = vsubps_avx512vl(local_1b8,(undefined1  [16])aVar3);
  uVar98 = auVar44._0_4_;
  auVar112._4_4_ = uVar98;
  auVar112._0_4_ = uVar98;
  auVar112._8_4_ = uVar98;
  auVar112._12_4_ = uVar98;
  auVar43 = vshufps_avx(auVar44,auVar44,0x55);
  auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
  aVar4 = (pre->ray_space).vx.field_0;
  aVar5 = (pre->ray_space).vy.field_0;
  fVar224 = (pre->ray_space).vz.field_0.m128[0];
  fVar208 = (pre->ray_space).vz.field_0.m128[1];
  fVar219 = (pre->ray_space).vz.field_0.m128[2];
  fVar220 = (pre->ray_space).vz.field_0.m128[3];
  auVar105._0_4_ = fVar224 * auVar44._0_4_;
  auVar105._4_4_ = fVar208 * auVar44._4_4_;
  auVar105._8_4_ = fVar219 * auVar44._8_4_;
  auVar105._12_4_ = fVar220 * auVar44._12_4_;
  auVar43 = vfmadd231ps_fma(auVar105,(undefined1  [16])aVar5,auVar43);
  auVar57 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar4,auVar112);
  auVar44 = vsubps_avx512vl(local_1c8,(undefined1  [16])aVar3);
  uVar98 = auVar44._0_4_;
  auVar117._4_4_ = uVar98;
  auVar117._0_4_ = uVar98;
  auVar117._8_4_ = uVar98;
  auVar117._12_4_ = uVar98;
  auVar43 = vshufps_avx(auVar44,auVar44,0x55);
  auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
  auVar113._0_4_ = fVar224 * auVar44._0_4_;
  auVar113._4_4_ = fVar208 * auVar44._4_4_;
  auVar113._8_4_ = fVar219 * auVar44._8_4_;
  auVar113._12_4_ = fVar220 * auVar44._12_4_;
  auVar43 = vfmadd231ps_fma(auVar113,(undefined1  [16])aVar5,auVar43);
  auVar41 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar4,auVar117);
  auVar44 = vsubps_avx512vl(local_1d8,(undefined1  [16])aVar3);
  uVar98 = auVar44._0_4_;
  auVar158._4_4_ = uVar98;
  auVar158._0_4_ = uVar98;
  auVar158._8_4_ = uVar98;
  auVar158._12_4_ = uVar98;
  auVar43 = vshufps_avx(auVar44,auVar44,0x55);
  auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
  auVar118._0_4_ = fVar224 * auVar44._0_4_;
  auVar118._4_4_ = fVar208 * auVar44._4_4_;
  auVar118._8_4_ = fVar219 * auVar44._8_4_;
  auVar118._12_4_ = fVar220 * auVar44._12_4_;
  auVar43 = vfmadd231ps_fma(auVar118,(undefined1  [16])aVar5,auVar43);
  auVar55 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar4,auVar158);
  auVar44 = vsubps_avx(local_1e8,(undefined1  [16])aVar3);
  uVar98 = auVar44._0_4_;
  auVar177._4_4_ = uVar98;
  auVar177._0_4_ = uVar98;
  auVar177._8_4_ = uVar98;
  auVar177._12_4_ = uVar98;
  auVar43 = vshufps_avx(auVar44,auVar44,0x55);
  auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
  auVar159._0_4_ = fVar224 * auVar44._0_4_;
  auVar159._4_4_ = fVar208 * auVar44._4_4_;
  auVar159._8_4_ = fVar219 * auVar44._8_4_;
  auVar159._12_4_ = fVar220 * auVar44._12_4_;
  auVar43 = vfmadd231ps_fma(auVar159,(undefined1  [16])aVar5,auVar43);
  auVar56 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar4,auVar177);
  auVar44 = vsubps_avx512vl(_local_1f8,(undefined1  [16])aVar3);
  uVar98 = auVar44._0_4_;
  auVar186._4_4_ = uVar98;
  auVar186._0_4_ = uVar98;
  auVar186._8_4_ = uVar98;
  auVar186._12_4_ = uVar98;
  auVar43 = vshufps_avx(auVar44,auVar44,0x55);
  auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
  auVar178._0_4_ = auVar44._0_4_ * fVar224;
  auVar178._4_4_ = auVar44._4_4_ * fVar208;
  auVar178._8_4_ = auVar44._8_4_ * fVar219;
  auVar178._12_4_ = auVar44._12_4_ * fVar220;
  auVar43 = vfmadd231ps_fma(auVar178,(undefined1  [16])aVar5,auVar43);
  auVar42 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar4,auVar186);
  auVar44 = vsubps_avx512vl(_local_208,(undefined1  [16])aVar3);
  uVar98 = auVar44._0_4_;
  auVar202._4_4_ = uVar98;
  auVar202._0_4_ = uVar98;
  auVar202._8_4_ = uVar98;
  auVar202._12_4_ = uVar98;
  auVar43 = vshufps_avx(auVar44,auVar44,0x55);
  auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
  auVar187._0_4_ = auVar44._0_4_ * fVar224;
  auVar187._4_4_ = auVar44._4_4_ * fVar208;
  auVar187._8_4_ = auVar44._8_4_ * fVar219;
  auVar187._12_4_ = auVar44._12_4_ * fVar220;
  auVar43 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar5,auVar43);
  auVar59 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar4,auVar202);
  auVar44 = vsubps_avx512vl(_local_218,(undefined1  [16])aVar3);
  uVar98 = auVar44._0_4_;
  auVar209._4_4_ = uVar98;
  auVar209._0_4_ = uVar98;
  auVar209._8_4_ = uVar98;
  auVar209._12_4_ = uVar98;
  auVar43 = vshufps_avx(auVar44,auVar44,0x55);
  auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
  auVar203._0_4_ = auVar44._0_4_ * fVar224;
  auVar203._4_4_ = auVar44._4_4_ * fVar208;
  auVar203._8_4_ = auVar44._8_4_ * fVar219;
  auVar203._12_4_ = auVar44._12_4_ * fVar220;
  auVar43 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar5,auVar43);
  auVar60 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar4,auVar209);
  auVar44 = vsubps_avx(_local_228,(undefined1  [16])aVar3);
  uVar98 = auVar44._0_4_;
  auVar210._4_4_ = uVar98;
  auVar210._0_4_ = uVar98;
  auVar210._8_4_ = uVar98;
  auVar210._12_4_ = uVar98;
  auVar43 = vshufps_avx(auVar44,auVar44,0x55);
  auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
  auVar133._0_4_ = fVar224 * auVar44._0_4_;
  auVar133._4_4_ = fVar208 * auVar44._4_4_;
  auVar133._8_4_ = fVar219 * auVar44._8_4_;
  auVar133._12_4_ = fVar220 * auVar44._12_4_;
  auVar43 = vfmadd231ps_fma(auVar133,(undefined1  [16])aVar5,auVar43);
  auVar62 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar4,auVar210);
  local_318 = vmovlhps_avx(auVar57,auVar42);
  local_198 = vmovlhps_avx(auVar41,auVar59);
  local_1a8 = vmovlhps_avx512f(auVar55,auVar60);
  _local_c8 = vmovlhps_avx512f(auVar56,auVar62);
  auVar44 = vminps_avx(local_318,local_198);
  auVar43 = vmaxps_avx(local_318,local_198);
  auVar40 = vminps_avx512vl(local_1a8,_local_c8);
  auVar44 = vminps_avx(auVar44,auVar40);
  auVar40 = vmaxps_avx512vl(local_1a8,_local_c8);
  auVar43 = vmaxps_avx(auVar43,auVar40);
  auVar40 = vshufpd_avx(auVar44,auVar44,3);
  auVar52 = vshufpd_avx(auVar43,auVar43,3);
  auVar44 = vminps_avx(auVar44,auVar40);
  auVar43 = vmaxps_avx(auVar43,auVar52);
  auVar44 = vandps_avx512vl(auVar44,auVar255._0_16_);
  auVar43 = vandps_avx512vl(auVar43,auVar255._0_16_);
  auVar43 = vmaxps_avx(auVar44,auVar43);
  auVar44 = vmovshdup_avx(auVar43);
  auVar43 = vmaxss_avx(auVar44,auVar43);
  lVar33 = uVar38 + 0xf;
  fVar224 = auVar43._0_4_ * 9.536743e-07;
  local_288._8_8_ = auVar57._0_8_;
  local_288._0_8_ = auVar57._0_8_;
  local_298._8_8_ = auVar41._0_8_;
  local_298._0_8_ = auVar41._0_8_;
  local_2a8 = vmovddup_avx512vl(auVar55);
  local_2b8 = vmovddup_avx512vl(auVar56);
  register0x00001348 = auVar42._0_8_;
  local_2c8 = auVar42._0_8_;
  register0x00001388 = auVar59._0_8_;
  local_2d8 = auVar59._0_8_;
  register0x00001408 = auVar60._0_8_;
  local_2e8 = auVar60._0_8_;
  register0x00001448 = auVar62._0_8_;
  local_2f8 = auVar62._0_8_;
  local_278 = ZEXT416((uint)fVar224);
  auVar106._4_4_ = fVar224;
  auVar106._0_4_ = fVar224;
  auVar106._8_4_ = fVar224;
  auVar106._12_4_ = fVar224;
  local_78._16_4_ = fVar224;
  local_78._0_16_ = auVar106;
  local_78._20_4_ = fVar224;
  local_78._24_4_ = fVar224;
  local_78._28_4_ = fVar224;
  auVar16._8_4_ = 0x80000000;
  auVar16._0_8_ = 0x8000000080000000;
  auVar16._12_4_ = 0x80000000;
  auVar43 = vxorps_avx512vl(auVar106,auVar16);
  local_98 = auVar43._0_4_;
  uStack_94 = local_98;
  uStack_90 = local_98;
  uStack_8c = local_98;
  uStack_88 = local_98;
  uStack_84 = local_98;
  uStack_80 = local_98;
  uStack_7c = local_98;
  local_d8 = vsubps_avx(local_198,local_318);
  local_e8 = vsubps_avx512vl(local_1a8,local_198);
  local_f8 = vsubps_avx512vl(_local_c8,local_1a8);
  local_108 = vsubps_avx512vl(_local_1f8,local_1b8);
  local_118 = vsubps_avx512vl(_local_208,local_1c8);
  local_128 = vsubps_avx512vl(_local_218,local_1d8);
  _local_138 = vsubps_avx(_local_228,local_1e8);
  uVar26 = 0;
  auVar43 = ZEXT816(0x3f80000000000000);
  auVar114 = auVar43;
LAB_01bc0574:
  do {
    auVar44 = vshufps_avx(auVar114,auVar114,0x50);
    auVar241._8_4_ = 0x3f800000;
    auVar241._0_8_ = 0x3f8000003f800000;
    auVar241._12_4_ = 0x3f800000;
    auVar244._16_4_ = 0x3f800000;
    auVar244._0_16_ = auVar241;
    auVar244._20_4_ = 0x3f800000;
    auVar244._24_4_ = 0x3f800000;
    auVar244._28_4_ = 0x3f800000;
    auVar40 = vsubps_avx(auVar241,auVar44);
    fVar224 = auVar44._0_4_;
    auVar134._0_4_ = local_2c8._0_4_ * fVar224;
    fVar208 = auVar44._4_4_;
    auVar134._4_4_ = local_2c8._4_4_ * fVar208;
    fVar219 = auVar44._8_4_;
    auVar134._8_4_ = local_2c8._8_4_ * fVar219;
    fVar220 = auVar44._12_4_;
    auVar134._12_4_ = local_2c8._12_4_ * fVar220;
    auVar143._0_4_ = local_2d8._0_4_ * fVar224;
    auVar143._4_4_ = local_2d8._4_4_ * fVar208;
    auVar143._8_4_ = local_2d8._8_4_ * fVar219;
    auVar143._12_4_ = local_2d8._12_4_ * fVar220;
    auVar160._0_4_ = local_2e8._0_4_ * fVar224;
    auVar160._4_4_ = local_2e8._4_4_ * fVar208;
    auVar160._8_4_ = local_2e8._8_4_ * fVar219;
    auVar160._12_4_ = local_2e8._12_4_ * fVar220;
    auVar119._0_4_ = local_2f8._0_4_ * fVar224;
    auVar119._4_4_ = local_2f8._4_4_ * fVar208;
    auVar119._8_4_ = local_2f8._8_4_ * fVar219;
    auVar119._12_4_ = local_2f8._12_4_ * fVar220;
    auVar52 = vfmadd231ps_fma(auVar134,auVar40,local_288);
    auVar57 = vfmadd231ps_fma(auVar143,auVar40,local_298);
    auVar41 = vfmadd231ps_avx512vl(auVar160,auVar40,local_2a8);
    auVar40 = vfmadd231ps_avx512vl(auVar119,local_2b8,auVar40);
    auVar44 = vmovshdup_avx(auVar43);
    fVar208 = auVar43._0_4_;
    fVar224 = (auVar44._0_4_ - fVar208) * 0.04761905;
    auVar150._4_4_ = fVar208;
    auVar150._0_4_ = fVar208;
    auVar150._8_4_ = fVar208;
    auVar150._12_4_ = fVar208;
    auVar150._16_4_ = fVar208;
    auVar150._20_4_ = fVar208;
    auVar150._24_4_ = fVar208;
    auVar150._28_4_ = fVar208;
    auVar74._0_8_ = auVar44._0_8_;
    auVar74._8_8_ = auVar74._0_8_;
    auVar74._16_8_ = auVar74._0_8_;
    auVar74._24_8_ = auVar74._0_8_;
    auVar83 = vsubps_avx(auVar74,auVar150);
    uVar98 = auVar52._0_4_;
    auVar129._4_4_ = uVar98;
    auVar129._0_4_ = uVar98;
    auVar129._8_4_ = uVar98;
    auVar129._12_4_ = uVar98;
    auVar129._16_4_ = uVar98;
    auVar129._20_4_ = uVar98;
    auVar129._24_4_ = uVar98;
    auVar129._28_4_ = uVar98;
    auVar75._8_4_ = 1;
    auVar75._0_8_ = 0x100000001;
    auVar75._12_4_ = 1;
    auVar75._16_4_ = 1;
    auVar75._20_4_ = 1;
    auVar75._24_4_ = 1;
    auVar75._28_4_ = 1;
    auVar82 = ZEXT1632(auVar52);
    auVar79 = vpermps_avx2(auVar75,auVar82);
    auVar64 = vbroadcastss_avx512vl(auVar57);
    auVar80 = ZEXT1632(auVar57);
    auVar65 = vpermps_avx512vl(auVar75,auVar80);
    auVar66 = vbroadcastss_avx512vl(auVar41);
    auVar81 = ZEXT1632(auVar41);
    auVar67 = vpermps_avx512vl(auVar75,auVar81);
    auVar68 = vbroadcastss_avx512vl(auVar40);
    auVar78 = ZEXT1632(auVar40);
    auVar69 = vpermps_avx512vl(auVar75,auVar78);
    auVar206._4_4_ = fVar224;
    auVar206._0_4_ = fVar224;
    auVar206._8_4_ = fVar224;
    auVar206._12_4_ = fVar224;
    auVar206._16_4_ = fVar224;
    auVar206._20_4_ = fVar224;
    auVar206._24_4_ = fVar224;
    auVar206._28_4_ = fVar224;
    auVar76._8_4_ = 2;
    auVar76._0_8_ = 0x200000002;
    auVar76._12_4_ = 2;
    auVar76._16_4_ = 2;
    auVar76._20_4_ = 2;
    auVar76._24_4_ = 2;
    auVar76._28_4_ = 2;
    auVar70 = vpermps_avx512vl(auVar76,auVar82);
    auVar71 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar72 = vpermps_avx512vl(auVar71,auVar82);
    auVar73 = vpermps_avx512vl(auVar76,auVar80);
    auVar74 = vpermps_avx512vl(auVar71,auVar80);
    auVar82 = vpermps_avx2(auVar76,auVar81);
    auVar75 = vpermps_avx512vl(auVar71,auVar81);
    auVar76 = vpermps_avx512vl(auVar76,auVar78);
    auVar77 = vpermps_avx512vl(auVar71,auVar78);
    auVar44 = vfmadd132ps_fma(auVar83,auVar150,_DAT_01faff20);
    auVar83 = vsubps_avx(auVar244,ZEXT1632(auVar44));
    auVar71 = vmulps_avx512vl(auVar64,ZEXT1632(auVar44));
    auVar80 = ZEXT1632(auVar44);
    auVar78 = vmulps_avx512vl(auVar65,auVar80);
    auVar40 = vfmadd231ps_fma(auVar71,auVar83,auVar129);
    auVar52 = vfmadd231ps_fma(auVar78,auVar83,auVar79);
    auVar71 = vmulps_avx512vl(auVar66,auVar80);
    auVar78 = vmulps_avx512vl(auVar67,auVar80);
    auVar64 = vfmadd231ps_avx512vl(auVar71,auVar83,auVar64);
    auVar65 = vfmadd231ps_avx512vl(auVar78,auVar83,auVar65);
    auVar71 = vmulps_avx512vl(auVar68,auVar80);
    auVar129 = ZEXT1632(auVar44);
    auVar69 = vmulps_avx512vl(auVar69,auVar129);
    auVar66 = vfmadd231ps_avx512vl(auVar71,auVar83,auVar66);
    auVar67 = vfmadd231ps_avx512vl(auVar69,auVar83,auVar67);
    fVar219 = auVar44._0_4_;
    fVar220 = auVar44._4_4_;
    auVar71._4_4_ = fVar220 * auVar64._4_4_;
    auVar71._0_4_ = fVar219 * auVar64._0_4_;
    fVar221 = auVar44._8_4_;
    auVar71._8_4_ = fVar221 * auVar64._8_4_;
    fVar222 = auVar44._12_4_;
    auVar71._12_4_ = fVar222 * auVar64._12_4_;
    auVar71._16_4_ = auVar64._16_4_ * 0.0;
    auVar71._20_4_ = auVar64._20_4_ * 0.0;
    auVar71._24_4_ = auVar64._24_4_ * 0.0;
    auVar71._28_4_ = fVar208;
    auVar78._4_4_ = fVar220 * auVar65._4_4_;
    auVar78._0_4_ = fVar219 * auVar65._0_4_;
    auVar78._8_4_ = fVar221 * auVar65._8_4_;
    auVar78._12_4_ = fVar222 * auVar65._12_4_;
    auVar78._16_4_ = auVar65._16_4_ * 0.0;
    auVar78._20_4_ = auVar65._20_4_ * 0.0;
    auVar78._24_4_ = auVar65._24_4_ * 0.0;
    auVar78._28_4_ = auVar79._28_4_;
    auVar40 = vfmadd231ps_fma(auVar71,auVar83,ZEXT1632(auVar40));
    auVar52 = vfmadd231ps_fma(auVar78,auVar83,ZEXT1632(auVar52));
    auVar84._0_4_ = fVar219 * auVar66._0_4_;
    auVar84._4_4_ = fVar220 * auVar66._4_4_;
    auVar84._8_4_ = fVar221 * auVar66._8_4_;
    auVar84._12_4_ = fVar222 * auVar66._12_4_;
    auVar84._16_4_ = auVar66._16_4_ * 0.0;
    auVar84._20_4_ = auVar66._20_4_ * 0.0;
    auVar84._24_4_ = auVar66._24_4_ * 0.0;
    auVar84._28_4_ = 0;
    auVar80._4_4_ = fVar220 * auVar67._4_4_;
    auVar80._0_4_ = fVar219 * auVar67._0_4_;
    auVar80._8_4_ = fVar221 * auVar67._8_4_;
    auVar80._12_4_ = fVar222 * auVar67._12_4_;
    auVar80._16_4_ = auVar67._16_4_ * 0.0;
    auVar80._20_4_ = auVar67._20_4_ * 0.0;
    auVar80._24_4_ = auVar67._24_4_ * 0.0;
    auVar80._28_4_ = auVar66._28_4_;
    auVar57 = vfmadd231ps_fma(auVar84,auVar83,auVar64);
    auVar41 = vfmadd231ps_fma(auVar80,auVar83,auVar65);
    auVar81._28_4_ = auVar65._28_4_;
    auVar81._0_28_ =
         ZEXT1628(CONCAT412(fVar222 * auVar41._12_4_,
                            CONCAT48(fVar221 * auVar41._8_4_,
                                     CONCAT44(fVar220 * auVar41._4_4_,fVar219 * auVar41._0_4_))));
    auVar55 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar222 * auVar57._12_4_,
                                                 CONCAT48(fVar221 * auVar57._8_4_,
                                                          CONCAT44(fVar220 * auVar57._4_4_,
                                                                   fVar219 * auVar57._0_4_)))),
                              auVar83,ZEXT1632(auVar40));
    auVar56 = vfmadd231ps_fma(auVar81,auVar83,ZEXT1632(auVar52));
    auVar79 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar40));
    auVar64 = vsubps_avx(ZEXT1632(auVar41),ZEXT1632(auVar52));
    auVar65 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar79 = vmulps_avx512vl(auVar79,auVar65);
    auVar64 = vmulps_avx512vl(auVar64,auVar65);
    auVar196._0_4_ = fVar224 * auVar79._0_4_;
    auVar196._4_4_ = fVar224 * auVar79._4_4_;
    auVar196._8_4_ = fVar224 * auVar79._8_4_;
    auVar196._12_4_ = fVar224 * auVar79._12_4_;
    auVar196._16_4_ = fVar224 * auVar79._16_4_;
    auVar196._20_4_ = fVar224 * auVar79._20_4_;
    auVar196._24_4_ = fVar224 * auVar79._24_4_;
    auVar196._28_4_ = 0;
    auVar79 = vmulps_avx512vl(auVar206,auVar64);
    auVar52 = vxorps_avx512vl(auVar68._0_16_,auVar68._0_16_);
    auVar64 = vpermt2ps_avx512vl(ZEXT1632(auVar55),_DAT_01feed00,ZEXT1632(auVar52));
    auVar66 = vpermt2ps_avx512vl(ZEXT1632(auVar56),_DAT_01feed00,ZEXT1632(auVar52));
    auVar124._0_4_ = auVar196._0_4_ + auVar55._0_4_;
    auVar124._4_4_ = auVar196._4_4_ + auVar55._4_4_;
    auVar124._8_4_ = auVar196._8_4_ + auVar55._8_4_;
    auVar124._12_4_ = auVar196._12_4_ + auVar55._12_4_;
    auVar124._16_4_ = auVar196._16_4_ + 0.0;
    auVar124._20_4_ = auVar196._20_4_ + 0.0;
    auVar124._24_4_ = auVar196._24_4_ + 0.0;
    auVar124._28_4_ = 0;
    auVar84 = ZEXT1632(auVar52);
    auVar67 = vpermt2ps_avx512vl(auVar196,_DAT_01feed00,auVar84);
    auVar68 = vaddps_avx512vl(ZEXT1632(auVar56),auVar79);
    auVar69 = vpermt2ps_avx512vl(auVar79,_DAT_01feed00,auVar84);
    auVar79 = vsubps_avx(auVar64,auVar67);
    auVar67 = vsubps_avx512vl(auVar66,auVar69);
    auVar69 = vmulps_avx512vl(auVar73,auVar129);
    auVar71 = vmulps_avx512vl(auVar74,auVar129);
    auVar69 = vfmadd231ps_avx512vl(auVar69,auVar83,auVar70);
    auVar71 = vfmadd231ps_avx512vl(auVar71,auVar83,auVar72);
    auVar78 = vmulps_avx512vl(auVar82,auVar129);
    auVar80 = vmulps_avx512vl(auVar75,auVar129);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar83,auVar73);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar83,auVar74);
    auVar81 = vmulps_avx512vl(auVar76,auVar129);
    auVar70 = vmulps_avx512vl(auVar77,auVar129);
    auVar40 = vfmadd231ps_fma(auVar81,auVar83,auVar82);
    auVar82 = vfmadd231ps_avx512vl(auVar70,auVar83,auVar75);
    auVar81 = vmulps_avx512vl(auVar129,auVar78);
    auVar72 = ZEXT1632(auVar44);
    auVar70 = vmulps_avx512vl(auVar72,auVar80);
    auVar69 = vfmadd231ps_avx512vl(auVar81,auVar83,auVar69);
    auVar71 = vfmadd231ps_avx512vl(auVar70,auVar83,auVar71);
    auVar82 = vmulps_avx512vl(auVar72,auVar82);
    auVar78 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar222 * auVar40._12_4_,
                                            CONCAT48(fVar221 * auVar40._8_4_,
                                                     CONCAT44(fVar220 * auVar40._4_4_,
                                                              fVar219 * auVar40._0_4_)))),auVar83,
                         auVar78);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar83,auVar80);
    auVar70._4_4_ = fVar220 * auVar78._4_4_;
    auVar70._0_4_ = fVar219 * auVar78._0_4_;
    auVar70._8_4_ = fVar221 * auVar78._8_4_;
    auVar70._12_4_ = fVar222 * auVar78._12_4_;
    auVar70._16_4_ = auVar78._16_4_ * 0.0;
    auVar70._20_4_ = auVar78._20_4_ * 0.0;
    auVar70._24_4_ = auVar78._24_4_ * 0.0;
    auVar70._28_4_ = auVar75._28_4_;
    auVar80 = vmulps_avx512vl(auVar72,auVar82);
    auVar81 = vfmadd231ps_avx512vl(auVar70,auVar83,auVar69);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar71,auVar83);
    auVar83 = vsubps_avx512vl(auVar78,auVar69);
    auVar82 = vsubps_avx512vl(auVar82,auVar71);
    auVar83 = vmulps_avx512vl(auVar83,auVar65);
    auVar82 = vmulps_avx512vl(auVar82,auVar65);
    fVar208 = fVar224 * auVar83._0_4_;
    fVar219 = fVar224 * auVar83._4_4_;
    auVar72._4_4_ = fVar219;
    auVar72._0_4_ = fVar208;
    fVar220 = fVar224 * auVar83._8_4_;
    auVar72._8_4_ = fVar220;
    fVar221 = fVar224 * auVar83._12_4_;
    auVar72._12_4_ = fVar221;
    fVar222 = fVar224 * auVar83._16_4_;
    auVar72._16_4_ = fVar222;
    fVar223 = fVar224 * auVar83._20_4_;
    auVar72._20_4_ = fVar223;
    fVar224 = fVar224 * auVar83._24_4_;
    auVar72._24_4_ = fVar224;
    auVar72._28_4_ = auVar83._28_4_;
    auVar82 = vmulps_avx512vl(auVar206,auVar82);
    auVar65 = vpermt2ps_avx512vl(auVar81,_DAT_01feed00,auVar84);
    auVar69 = vpermt2ps_avx512vl(auVar80,_DAT_01feed00,auVar84);
    auVar207._0_4_ = auVar81._0_4_ + fVar208;
    auVar207._4_4_ = auVar81._4_4_ + fVar219;
    auVar207._8_4_ = auVar81._8_4_ + fVar220;
    auVar207._12_4_ = auVar81._12_4_ + fVar221;
    auVar207._16_4_ = auVar81._16_4_ + fVar222;
    auVar207._20_4_ = auVar81._20_4_ + fVar223;
    auVar207._24_4_ = auVar81._24_4_ + fVar224;
    auVar207._28_4_ = auVar81._28_4_ + auVar83._28_4_;
    auVar83 = vpermt2ps_avx512vl(auVar72,_DAT_01feed00,ZEXT1632(auVar52));
    auVar71 = vaddps_avx512vl(auVar80,auVar82);
    auVar82 = vpermt2ps_avx512vl(auVar82,_DAT_01feed00,ZEXT1632(auVar52));
    auVar83 = vsubps_avx(auVar65,auVar83);
    auVar82 = vsubps_avx512vl(auVar69,auVar82);
    auVar129 = ZEXT1632(auVar55);
    auVar78 = vsubps_avx512vl(auVar81,auVar129);
    auVar150 = ZEXT1632(auVar56);
    auVar70 = vsubps_avx512vl(auVar80,auVar150);
    auVar72 = vsubps_avx512vl(auVar65,auVar64);
    auVar78 = vaddps_avx512vl(auVar78,auVar72);
    auVar72 = vsubps_avx512vl(auVar69,auVar66);
    auVar70 = vaddps_avx512vl(auVar70,auVar72);
    auVar72 = vmulps_avx512vl(auVar150,auVar78);
    auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar129,auVar70);
    auVar73 = vmulps_avx512vl(auVar68,auVar78);
    auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar124,auVar70);
    auVar74 = vmulps_avx512vl(auVar67,auVar78);
    auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar79,auVar70);
    auVar75 = vmulps_avx512vl(auVar66,auVar78);
    auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar64,auVar70);
    auVar76 = vmulps_avx512vl(auVar80,auVar78);
    auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar81,auVar70);
    auVar77 = vmulps_avx512vl(auVar71,auVar78);
    auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar207,auVar70);
    auVar84 = vmulps_avx512vl(auVar82,auVar78);
    auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar83,auVar70);
    auVar78 = vmulps_avx512vl(auVar69,auVar78);
    auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar65,auVar70);
    auVar70 = vminps_avx512vl(auVar72,auVar73);
    auVar72 = vmaxps_avx512vl(auVar72,auVar73);
    auVar73 = vminps_avx512vl(auVar74,auVar75);
    auVar70 = vminps_avx512vl(auVar70,auVar73);
    auVar73 = vmaxps_avx512vl(auVar74,auVar75);
    auVar72 = vmaxps_avx512vl(auVar72,auVar73);
    auVar73 = vminps_avx512vl(auVar76,auVar77);
    auVar74 = vmaxps_avx512vl(auVar76,auVar77);
    auVar75 = vminps_avx512vl(auVar84,auVar78);
    auVar73 = vminps_avx512vl(auVar73,auVar75);
    auVar70 = vminps_avx512vl(auVar70,auVar73);
    auVar78 = vmaxps_avx512vl(auVar84,auVar78);
    auVar78 = vmaxps_avx512vl(auVar74,auVar78);
    auVar78 = vmaxps_avx512vl(auVar72,auVar78);
    uVar14 = vcmpps_avx512vl(auVar70,local_78,2);
    auVar73._4_4_ = uStack_94;
    auVar73._0_4_ = local_98;
    auVar73._8_4_ = uStack_90;
    auVar73._12_4_ = uStack_8c;
    auVar73._16_4_ = uStack_88;
    auVar73._20_4_ = uStack_84;
    auVar73._24_4_ = uStack_80;
    auVar73._28_4_ = uStack_7c;
    uVar15 = vcmpps_avx512vl(auVar78,auVar73,5);
    bVar24 = (byte)uVar14 & (byte)uVar15 & 0x7f;
    if (bVar24 == 0) {
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar254 = ZEXT1664(auVar43);
      auVar83 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar252 = ZEXT3264(auVar83);
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar253 = ZEXT1664(auVar43);
      in_ZMM23 = ZEXT3264(_DAT_01feed20);
      auVar83 = _DAT_01feed20;
    }
    else {
      auVar78 = vsubps_avx512vl(auVar64,auVar129);
      auVar70 = vsubps_avx512vl(auVar66,auVar150);
      auVar72 = vsubps_avx512vl(auVar65,auVar81);
      auVar78 = vaddps_avx512vl(auVar78,auVar72);
      auVar72 = vsubps_avx512vl(auVar69,auVar80);
      auVar70 = vaddps_avx512vl(auVar70,auVar72);
      auVar72 = vmulps_avx512vl(auVar150,auVar78);
      auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar70,auVar129);
      auVar68 = vmulps_avx512vl(auVar68,auVar78);
      auVar68 = vfnmadd213ps_avx512vl(auVar124,auVar70,auVar68);
      auVar67 = vmulps_avx512vl(auVar67,auVar78);
      auVar67 = vfnmadd213ps_avx512vl(auVar79,auVar70,auVar67);
      auVar79 = vmulps_avx512vl(auVar66,auVar78);
      auVar66 = vfnmadd231ps_avx512vl(auVar79,auVar70,auVar64);
      auVar79 = vmulps_avx512vl(auVar80,auVar78);
      auVar80 = vfnmadd231ps_avx512vl(auVar79,auVar70,auVar81);
      auVar79 = vmulps_avx512vl(auVar71,auVar78);
      auVar71 = vfnmadd213ps_avx512vl(auVar207,auVar70,auVar79);
      auVar79 = vmulps_avx512vl(auVar82,auVar78);
      auVar81 = vfnmadd213ps_avx512vl(auVar83,auVar70,auVar79);
      auVar83 = vmulps_avx512vl(auVar69,auVar78);
      auVar69 = vfnmadd231ps_avx512vl(auVar83,auVar65,auVar70);
      auVar79 = vminps_avx(auVar72,auVar68);
      auVar83 = vmaxps_avx(auVar72,auVar68);
      auVar64 = vminps_avx(auVar67,auVar66);
      auVar64 = vminps_avx(auVar79,auVar64);
      auVar79 = vmaxps_avx(auVar67,auVar66);
      auVar83 = vmaxps_avx(auVar83,auVar79);
      auVar82 = vminps_avx(auVar80,auVar71);
      auVar79 = vmaxps_avx(auVar80,auVar71);
      auVar65 = vminps_avx(auVar81,auVar69);
      auVar82 = vminps_avx(auVar82,auVar65);
      auVar82 = vminps_avx(auVar64,auVar82);
      auVar64 = vmaxps_avx(auVar81,auVar69);
      auVar79 = vmaxps_avx(auVar79,auVar64);
      auVar83 = vmaxps_avx(auVar83,auVar79);
      uVar14 = vcmpps_avx512vl(auVar83,auVar73,5);
      uVar15 = vcmpps_avx512vl(auVar82,local_78,2);
      bVar24 = bVar24 & (byte)uVar14 & (byte)uVar15;
      in_ZMM23 = ZEXT3264(_DAT_01feed20);
      if (bVar24 != 0) {
        auStack_188[uVar26] = (uint)bVar24;
        uVar14 = vmovlps_avx(auVar43);
        (&uStack_b8)[uVar26] = uVar14;
        uVar2 = vmovlps_avx(auVar114);
        auStack_58[uVar26] = uVar2;
        uVar26 = (ulong)((int)uVar26 + 1);
      }
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar254 = ZEXT1664(auVar43);
      auVar83 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar252 = ZEXT3264(auVar83);
      auVar83._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar253 = ZEXT1664(auVar83._0_16_);
    }
LAB_01bc0ac8:
    do {
      do {
        do {
          auVar44 = auVar256._0_16_;
          auVar40 = auVar258._0_16_;
          if ((int)uVar26 == 0) {
            fVar224 = (ray->super_RayK<1>).tfar;
            auVar22._4_4_ = fVar224;
            auVar22._0_4_ = fVar224;
            auVar22._8_4_ = fVar224;
            auVar22._12_4_ = fVar224;
            uVar14 = vcmpps_avx512vl(local_148,auVar22,2);
            uVar32 = (uint)uVar38 & (uint)lVar33 & (uint)uVar14;
            uVar38 = (ulong)uVar32;
            if (uVar32 == 0) {
              return;
            }
            goto LAB_01bbfacb;
          }
          uVar25 = (int)uVar26 - 1;
          uVar27 = (ulong)uVar25;
          uVar7 = auStack_188[uVar27];
          auVar114._8_8_ = 0;
          auVar114._0_8_ = auStack_58[uVar27];
          uVar2 = 0;
          for (uVar31 = (ulong)uVar7; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000)
          {
            uVar2 = uVar2 + 1;
          }
          uVar29 = uVar7 - 1 & uVar7;
          bVar36 = uVar29 == 0;
          auStack_188[uVar27] = uVar29;
          if (bVar36) {
            uVar26 = (ulong)uVar25;
          }
          auVar107._8_8_ = 0;
          auVar107._0_8_ = uVar2;
          auVar43 = vpunpcklqdq_avx(auVar107,ZEXT416((int)uVar2 + 1));
          auVar43 = vcvtqq2ps_avx512vl(auVar43);
          auVar43 = vmulps_avx512vl(auVar43,auVar253._0_16_);
          uVar98 = *(undefined4 *)((long)&uStack_b8 + uVar27 * 8 + 4);
          auVar17._4_4_ = uVar98;
          auVar17._0_4_ = uVar98;
          auVar17._8_4_ = uVar98;
          auVar17._12_4_ = uVar98;
          auVar52 = vmulps_avx512vl(auVar43,auVar17);
          auVar43 = vsubps_avx512vl(auVar44,auVar43);
          uVar98 = *(undefined4 *)(&uStack_b8 + uVar27);
          auVar18._4_4_ = uVar98;
          auVar18._0_4_ = uVar98;
          auVar18._8_4_ = uVar98;
          auVar18._12_4_ = uVar98;
          auVar43 = vfmadd231ps_avx512vl(auVar52,auVar43,auVar18);
          auVar52 = vmovshdup_avx(auVar43);
          fVar224 = auVar52._0_4_ - auVar43._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar224));
          if (uVar7 == 0 || bVar36) goto LAB_01bc0574;
          auVar52 = vshufps_avx(auVar114,auVar114,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar224));
          auVar55 = vsubps_avx512vl(auVar44,auVar52);
          fVar208 = auVar52._0_4_;
          auVar144._0_4_ = fVar208 * (float)local_2c8._0_4_;
          fVar219 = auVar52._4_4_;
          auVar144._4_4_ = fVar219 * (float)local_2c8._4_4_;
          fVar220 = auVar52._8_4_;
          auVar144._8_4_ = fVar220 * fStack_2c0;
          fVar221 = auVar52._12_4_;
          auVar144._12_4_ = fVar221 * fStack_2bc;
          auVar161._0_4_ = fVar208 * (float)local_2d8._0_4_;
          auVar161._4_4_ = fVar219 * (float)local_2d8._4_4_;
          auVar161._8_4_ = fVar220 * fStack_2d0;
          auVar161._12_4_ = fVar221 * fStack_2cc;
          auVar169._0_4_ = fVar208 * (float)local_2e8._0_4_;
          auVar169._4_4_ = fVar219 * (float)local_2e8._4_4_;
          auVar169._8_4_ = fVar220 * fStack_2e0;
          auVar169._12_4_ = fVar221 * fStack_2dc;
          auVar125._0_4_ = fVar208 * (float)local_2f8._0_4_;
          auVar125._4_4_ = fVar219 * (float)local_2f8._4_4_;
          auVar125._8_4_ = fVar220 * fStack_2f0;
          auVar125._12_4_ = fVar221 * fStack_2ec;
          auVar52 = vfmadd231ps_fma(auVar144,auVar55,local_288);
          auVar57 = vfmadd231ps_fma(auVar161,auVar55,local_298);
          auVar41 = vfmadd231ps_fma(auVar169,auVar55,local_2a8);
          auVar55 = vfmadd231ps_fma(auVar125,auVar55,local_2b8);
          auVar77._16_16_ = auVar52;
          auVar77._0_16_ = auVar52;
          auVar151._16_16_ = auVar57;
          auVar151._0_16_ = auVar57;
          auVar165._16_16_ = auVar41;
          auVar165._0_16_ = auVar41;
          auVar79 = vpermps_avx512vl(in_ZMM23._0_32_,ZEXT1632(auVar43));
          auVar83 = vsubps_avx(auVar151,auVar77);
          auVar57 = vfmadd213ps_fma(auVar83,auVar79,auVar77);
          auVar83 = vsubps_avx(auVar165,auVar151);
          auVar56 = vfmadd213ps_fma(auVar83,auVar79,auVar151);
          auVar52 = vsubps_avx(auVar55,auVar41);
          auVar152._16_16_ = auVar52;
          auVar152._0_16_ = auVar52;
          auVar52 = vfmadd213ps_fma(auVar152,auVar79,auVar165);
          auVar83 = vsubps_avx(ZEXT1632(auVar56),ZEXT1632(auVar57));
          auVar57 = vfmadd213ps_fma(auVar83,auVar79,ZEXT1632(auVar57));
          auVar83 = vsubps_avx(ZEXT1632(auVar52),ZEXT1632(auVar56));
          auVar52 = vfmadd213ps_fma(auVar83,auVar79,ZEXT1632(auVar56));
          auVar83 = vsubps_avx(ZEXT1632(auVar52),ZEXT1632(auVar57));
          auVar63 = vfmadd231ps_fma(ZEXT1632(auVar57),auVar83,auVar79);
          auVar83 = vmulps_avx512vl(auVar83,auVar252._0_32_);
          auVar52 = vmulss_avx512f(ZEXT416((uint)fVar224),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar208 = auVar52._0_4_;
          auVar170._0_8_ =
               CONCAT44(auVar63._4_4_ + fVar208 * auVar83._4_4_,
                        auVar63._0_4_ + fVar208 * auVar83._0_4_);
          auVar170._8_4_ = auVar63._8_4_ + fVar208 * auVar83._8_4_;
          auVar170._12_4_ = auVar63._12_4_ + fVar208 * auVar83._12_4_;
          auVar145._0_4_ = fVar208 * auVar83._16_4_;
          auVar145._4_4_ = fVar208 * auVar83._20_4_;
          auVar145._8_4_ = fVar208 * auVar83._24_4_;
          auVar145._12_4_ = fVar208 * auVar83._28_4_;
          auVar62 = vsubps_avx((undefined1  [16])0x0,auVar145);
          auVar56 = vshufpd_avx(auVar63,auVar63,3);
          auVar42 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar52 = vsubps_avx(auVar56,auVar63);
          auVar57 = vsubps_avx(auVar42,(undefined1  [16])0x0);
          auVar188._0_4_ = auVar52._0_4_ + auVar57._0_4_;
          auVar188._4_4_ = auVar52._4_4_ + auVar57._4_4_;
          auVar188._8_4_ = auVar52._8_4_ + auVar57._8_4_;
          auVar188._12_4_ = auVar52._12_4_ + auVar57._12_4_;
          auVar52 = vshufps_avx(auVar63,auVar63,0xb1);
          auVar57 = vshufps_avx(auVar170,auVar170,0xb1);
          auVar41 = vshufps_avx(auVar62,auVar62,0xb1);
          auVar55 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar242._4_4_ = auVar188._0_4_;
          auVar242._0_4_ = auVar188._0_4_;
          auVar242._8_4_ = auVar188._0_4_;
          auVar242._12_4_ = auVar188._0_4_;
          auVar59 = vshufps_avx(auVar188,auVar188,0x55);
          fVar208 = auVar59._0_4_;
          auVar204._0_4_ = auVar52._0_4_ * fVar208;
          fVar219 = auVar59._4_4_;
          auVar204._4_4_ = auVar52._4_4_ * fVar219;
          fVar220 = auVar59._8_4_;
          auVar204._8_4_ = auVar52._8_4_ * fVar220;
          fVar221 = auVar59._12_4_;
          auVar204._12_4_ = auVar52._12_4_ * fVar221;
          auVar211._0_4_ = auVar57._0_4_ * fVar208;
          auVar211._4_4_ = auVar57._4_4_ * fVar219;
          auVar211._8_4_ = auVar57._8_4_ * fVar220;
          auVar211._12_4_ = auVar57._12_4_ * fVar221;
          auVar226._0_4_ = auVar41._0_4_ * fVar208;
          auVar226._4_4_ = auVar41._4_4_ * fVar219;
          auVar226._8_4_ = auVar41._8_4_ * fVar220;
          auVar226._12_4_ = auVar41._12_4_ * fVar221;
          auVar189._0_4_ = auVar55._0_4_ * fVar208;
          auVar189._4_4_ = auVar55._4_4_ * fVar219;
          auVar189._8_4_ = auVar55._8_4_ * fVar220;
          auVar189._12_4_ = auVar55._12_4_ * fVar221;
          auVar52 = vfmadd231ps_fma(auVar204,auVar242,auVar63);
          auVar57 = vfmadd231ps_fma(auVar211,auVar242,auVar170);
          auVar61 = vfmadd231ps_fma(auVar226,auVar242,auVar62);
          auVar39 = vfmadd231ps_fma(auVar189,(undefined1  [16])0x0,auVar242);
          auVar59 = vshufpd_avx(auVar52,auVar52,1);
          auVar60 = vshufpd_avx(auVar57,auVar57,1);
          auVar45 = vshufpd_avx512vl(auVar61,auVar61,1);
          auVar46 = vshufpd_avx512vl(auVar39,auVar39,1);
          auVar41 = vminss_avx(auVar52,auVar57);
          auVar52 = vmaxss_avx(auVar57,auVar52);
          auVar55 = vminss_avx(auVar61,auVar39);
          auVar57 = vmaxss_avx(auVar39,auVar61);
          auVar41 = vminss_avx(auVar41,auVar55);
          auVar52 = vmaxss_avx(auVar57,auVar52);
          auVar55 = vminss_avx(auVar59,auVar60);
          auVar57 = vmaxss_avx(auVar60,auVar59);
          auVar59 = vminss_avx512f(auVar45,auVar46);
          auVar60 = vmaxss_avx512f(auVar46,auVar45);
          auVar57 = vmaxss_avx(auVar60,auVar57);
          auVar83._0_16_ = vminss_avx512f(auVar55,auVar59);
          vucomiss_avx512f(auVar41);
          fVar219 = auVar57._0_4_;
          fVar208 = auVar52._0_4_;
          if (4 < (uint)uVar26) {
            bVar37 = fVar219 == -0.0001;
            bVar34 = NAN(fVar219);
            if (fVar219 <= -0.0001) goto LAB_01bc0ce6;
            break;
          }
LAB_01bc0ce6:
          auVar55 = vucomiss_avx512f(auVar83._0_16_);
          bVar37 = fVar219 <= -0.0001;
          bVar35 = -0.0001 < fVar208;
          bVar34 = bVar37;
          if (!bVar37) break;
          uVar14 = vcmpps_avx512vl(auVar41,auVar55,5);
          uVar15 = vcmpps_avx512vl(auVar83._0_16_,auVar55,5);
          uVar25 = (uint)uVar14 & (uint)uVar15;
          bVar23 = (uVar25 & 1) == 0;
          bVar37 = bVar35 && bVar23;
          bVar34 = bVar35 && (uVar25 & 1) == 0;
        } while (!bVar35 || !bVar23);
        vcmpss_avx512f(auVar41,auVar40,1);
        auVar60 = auVar257._0_16_;
        uVar14 = vcmpss_avx512f(auVar52,auVar40,1);
        bVar35 = (bool)((byte)uVar14 & 1);
        auVar86._16_16_ = auVar83._16_16_;
        auVar86._0_16_ = auVar60;
        iVar97 = auVar257._0_4_;
        auVar85._4_28_ = auVar86._4_28_;
        auVar85._0_4_ = (float)((uint)bVar35 * -0x40800000 + (uint)!bVar35 * iVar97);
        vucomiss_avx512f(auVar85._0_16_);
        bVar34 = (bool)(!bVar37 | bVar34);
        bVar35 = bVar34 == false;
        auVar88._16_16_ = auVar83._16_16_;
        auVar88._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar87._4_28_ = auVar88._4_28_;
        auVar87._0_4_ = (uint)bVar34 * auVar258._0_4_ + (uint)!bVar34 * 0x7f800000;
        auVar59 = auVar87._0_16_;
        auVar90._16_16_ = auVar83._16_16_;
        auVar90._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar89._4_28_ = auVar90._4_28_;
        auVar89._0_4_ = (uint)bVar34 * auVar258._0_4_ + (uint)!bVar34 * -0x800000;
        auVar55 = auVar89._0_16_;
        uVar14 = vcmpss_avx512f(auVar83._0_16_,auVar40,1);
        bVar37 = (bool)((byte)uVar14 & 1);
        auVar92._16_16_ = auVar83._16_16_;
        auVar92._0_16_ = auVar60;
        auVar91._4_28_ = auVar92._4_28_;
        auVar91._0_4_ = (float)((uint)bVar37 * -0x40800000 + (uint)!bVar37 * iVar97);
        vucomiss_avx512f(auVar91._0_16_);
        if ((bVar34) || (bVar35)) {
          auVar61 = vucomiss_avx512f(auVar41);
          if ((bVar34) || (bVar35)) {
            auVar21._8_4_ = 0x80000000;
            auVar21._0_8_ = 0x8000000080000000;
            auVar21._12_4_ = 0x80000000;
            auVar39 = vxorps_avx512vl(auVar41,auVar21);
            auVar41 = vsubss_avx512f(auVar61,auVar41);
            auVar41 = vdivss_avx512f(auVar39,auVar41);
            auVar61 = vsubss_avx512f(auVar60,auVar41);
            auVar41 = vfmadd213ss_avx512f(auVar61,auVar40,auVar41);
            auVar61 = auVar41;
          }
          else {
            auVar61 = vxorps_avx512vl(auVar61,auVar61);
            vucomiss_avx512f(auVar61);
            if ((bVar34) || (auVar41 = auVar60, bVar35)) {
              auVar41 = SUB6416(ZEXT464(0xff800000),0);
              auVar61 = ZEXT416(0x7f800000);
            }
          }
          auVar59 = vminss_avx512f(auVar59,auVar61);
          auVar55 = vmaxss_avx(auVar41,auVar55);
        }
        uVar14 = vcmpss_avx512f(auVar57,auVar40,1);
        bVar37 = (bool)((byte)uVar14 & 1);
        fVar220 = (float)((uint)bVar37 * -0x40800000 + (uint)!bVar37 * iVar97);
        if ((auVar85._0_4_ != fVar220) || (NAN(auVar85._0_4_) || NAN(fVar220))) {
          if ((fVar219 != fVar208) || (NAN(fVar219) || NAN(fVar208))) {
            auVar20._8_4_ = 0x80000000;
            auVar20._0_8_ = 0x8000000080000000;
            auVar20._12_4_ = 0x80000000;
            auVar52 = vxorps_avx512vl(auVar52,auVar20);
            auVar190._0_4_ = auVar52._0_4_ / (fVar219 - fVar208);
            auVar190._4_12_ = auVar52._4_12_;
            auVar52 = vsubss_avx512f(auVar60,auVar190);
            auVar52 = vfmadd213ss_avx512f(auVar52,auVar40,auVar190);
            auVar57 = auVar52;
          }
          else if ((fVar208 != 0.0) ||
                  (auVar52 = auVar60, auVar57 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar208))) {
            auVar52 = SUB6416(ZEXT464(0xff800000),0);
            auVar57 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar59 = vminss_avx(auVar59,auVar57);
          auVar55 = vmaxss_avx(auVar52,auVar55);
        }
        bVar37 = auVar91._0_4_ != fVar220;
        auVar52 = vminss_avx512f(auVar59,auVar60);
        auVar94._16_16_ = auVar83._16_16_;
        auVar94._0_16_ = auVar59;
        auVar93._4_28_ = auVar94._4_28_;
        auVar93._0_4_ = (uint)bVar37 * auVar52._0_4_ + (uint)!bVar37 * auVar59._0_4_;
        auVar52 = vmaxss_avx512f(auVar60,auVar55);
        auVar96._16_16_ = auVar83._16_16_;
        auVar96._0_16_ = auVar55;
        auVar95._4_28_ = auVar96._4_28_;
        auVar95._0_4_ = (uint)bVar37 * auVar52._0_4_ + (uint)!bVar37 * auVar55._0_4_;
        auVar52 = vmaxss_avx512f(auVar40,auVar93._0_16_);
        auVar83._0_16_ = vminss_avx512f(auVar95._0_16_,auVar60);
      } while (auVar83._0_4_ < auVar52._0_4_);
      auVar55 = vmaxss_avx512f(auVar40,ZEXT416((uint)(auVar52._0_4_ + -0.1)));
      auVar61 = vminss_avx512f(ZEXT416((uint)(auVar83._0_4_ + 0.1)),auVar60);
      auVar126._0_8_ = auVar63._0_8_;
      auVar126._8_8_ = auVar126._0_8_;
      auVar212._8_8_ = auVar170._0_8_;
      auVar212._0_8_ = auVar170._0_8_;
      auVar227._8_8_ = auVar62._0_8_;
      auVar227._0_8_ = auVar62._0_8_;
      auVar52 = vshufpd_avx(auVar170,auVar170,3);
      auVar57 = vshufpd_avx(auVar62,auVar62,3);
      auVar41 = vshufps_avx(auVar55,auVar61,0);
      auVar62 = vsubps_avx512vl(auVar44,auVar41);
      fVar208 = auVar41._0_4_;
      auVar162._0_4_ = fVar208 * auVar56._0_4_;
      fVar219 = auVar41._4_4_;
      auVar162._4_4_ = fVar219 * auVar56._4_4_;
      fVar220 = auVar41._8_4_;
      auVar162._8_4_ = fVar220 * auVar56._8_4_;
      fVar221 = auVar41._12_4_;
      auVar162._12_4_ = fVar221 * auVar56._12_4_;
      auVar171._0_4_ = fVar208 * auVar52._0_4_;
      auVar171._4_4_ = fVar219 * auVar52._4_4_;
      auVar171._8_4_ = fVar220 * auVar52._8_4_;
      auVar171._12_4_ = fVar221 * auVar52._12_4_;
      auVar247._0_4_ = auVar57._0_4_ * fVar208;
      auVar247._4_4_ = auVar57._4_4_ * fVar219;
      auVar247._8_4_ = auVar57._8_4_ * fVar220;
      auVar247._12_4_ = auVar57._12_4_ * fVar221;
      auVar146._0_4_ = fVar208 * auVar42._0_4_;
      auVar146._4_4_ = fVar219 * auVar42._4_4_;
      auVar146._8_4_ = fVar220 * auVar42._8_4_;
      auVar146._12_4_ = fVar221 * auVar42._12_4_;
      auVar56 = vfmadd231ps_fma(auVar162,auVar62,auVar126);
      auVar42 = vfmadd231ps_fma(auVar171,auVar62,auVar212);
      auVar59 = vfmadd231ps_fma(auVar247,auVar62,auVar227);
      auVar62 = vfmadd231ps_fma(auVar146,auVar62,ZEXT816(0));
      auVar57 = vsubss_avx512f(auVar60,auVar55);
      auVar52 = vmovshdup_avx(auVar114);
      auVar45 = vfmadd231ss_fma(ZEXT416((uint)(auVar52._0_4_ * auVar55._0_4_)),auVar114,auVar57);
      auVar57 = vsubss_avx512f(auVar60,auVar61);
      auVar46 = vfmadd231ss_fma(ZEXT416((uint)(auVar52._0_4_ * auVar61._0_4_)),auVar114,auVar57);
      auVar61 = vdivss_avx512f(auVar60,ZEXT416((uint)fVar224));
      auVar52 = vsubps_avx(auVar42,auVar56);
      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar41 = vmulps_avx512vl(auVar52,auVar39);
      auVar52 = vsubps_avx(auVar59,auVar42);
      auVar55 = vmulps_avx512vl(auVar52,auVar39);
      auVar52 = vsubps_avx(auVar62,auVar59);
      auVar52 = vmulps_avx512vl(auVar52,auVar39);
      auVar57 = vminps_avx(auVar55,auVar52);
      auVar52 = vmaxps_avx(auVar55,auVar52);
      auVar57 = vminps_avx(auVar41,auVar57);
      auVar52 = vmaxps_avx(auVar41,auVar52);
      auVar41 = vshufpd_avx(auVar57,auVar57,3);
      auVar55 = vshufpd_avx(auVar52,auVar52,3);
      auVar57 = vminps_avx(auVar57,auVar41);
      auVar52 = vmaxps_avx(auVar52,auVar55);
      fVar224 = auVar61._0_4_;
      auVar191._0_4_ = auVar57._0_4_ * fVar224;
      auVar191._4_4_ = auVar57._4_4_ * fVar224;
      auVar191._8_4_ = auVar57._8_4_ * fVar224;
      auVar191._12_4_ = auVar57._12_4_ * fVar224;
      auVar179._0_4_ = fVar224 * auVar52._0_4_;
      auVar179._4_4_ = fVar224 * auVar52._4_4_;
      auVar179._8_4_ = fVar224 * auVar52._8_4_;
      auVar179._12_4_ = fVar224 * auVar52._12_4_;
      auVar61 = vdivss_avx512f(auVar60,ZEXT416((uint)(auVar46._0_4_ - auVar45._0_4_)));
      auVar52 = vshufpd_avx(auVar56,auVar56,3);
      auVar57 = vshufpd_avx(auVar42,auVar42,3);
      auVar41 = vshufpd_avx(auVar59,auVar59,3);
      auVar55 = vshufpd_avx(auVar62,auVar62,3);
      auVar52 = vsubps_avx(auVar52,auVar56);
      auVar56 = vsubps_avx(auVar57,auVar42);
      auVar42 = vsubps_avx(auVar41,auVar59);
      auVar55 = vsubps_avx(auVar55,auVar62);
      auVar57 = vminps_avx(auVar52,auVar56);
      auVar52 = vmaxps_avx(auVar52,auVar56);
      auVar41 = vminps_avx(auVar42,auVar55);
      auVar41 = vminps_avx(auVar57,auVar41);
      auVar57 = vmaxps_avx(auVar42,auVar55);
      auVar52 = vmaxps_avx(auVar52,auVar57);
      fVar224 = auVar61._0_4_;
      auVar228._0_4_ = fVar224 * auVar41._0_4_;
      auVar228._4_4_ = fVar224 * auVar41._4_4_;
      auVar228._8_4_ = fVar224 * auVar41._8_4_;
      auVar228._12_4_ = fVar224 * auVar41._12_4_;
      auVar213._0_4_ = fVar224 * auVar52._0_4_;
      auVar213._4_4_ = fVar224 * auVar52._4_4_;
      auVar213._8_4_ = fVar224 * auVar52._8_4_;
      auVar213._12_4_ = fVar224 * auVar52._12_4_;
      auVar55 = vinsertps_avx(auVar43,auVar45,0x10);
      auVar47 = vpermt2ps_avx512vl(auVar43,_DAT_01feecd0,auVar46);
      auVar115._0_4_ = auVar55._0_4_ + auVar47._0_4_;
      auVar115._4_4_ = auVar55._4_4_ + auVar47._4_4_;
      auVar115._8_4_ = auVar55._8_4_ + auVar47._8_4_;
      auVar115._12_4_ = auVar55._12_4_ + auVar47._12_4_;
      auVar61 = vmulps_avx512vl(auVar115,auVar254._0_16_);
      auVar57 = vshufps_avx(auVar61,auVar61,0x54);
      uVar98 = auVar61._0_4_;
      auVar120._4_4_ = uVar98;
      auVar120._0_4_ = uVar98;
      auVar120._8_4_ = uVar98;
      auVar120._12_4_ = uVar98;
      auVar42 = vfmadd213ps_avx512vl(local_d8,auVar120,local_318);
      auVar41 = vfmadd213ps_fma(local_e8,auVar120,local_198);
      auVar56 = vfmadd213ps_fma(local_f8,auVar120,local_1a8);
      auVar52 = vsubps_avx(auVar41,auVar42);
      auVar42 = vfmadd213ps_fma(auVar52,auVar120,auVar42);
      auVar52 = vsubps_avx(auVar56,auVar41);
      auVar52 = vfmadd213ps_fma(auVar52,auVar120,auVar41);
      auVar52 = vsubps_avx(auVar52,auVar42);
      auVar41 = vfmadd231ps_fma(auVar42,auVar52,auVar120);
      auVar59 = vmulps_avx512vl(auVar52,auVar39);
      auVar235._8_8_ = auVar41._0_8_;
      auVar235._0_8_ = auVar41._0_8_;
      auVar52 = vshufpd_avx(auVar41,auVar41,3);
      auVar41 = vshufps_avx(auVar61,auVar61,0x55);
      auVar56 = vsubps_avx(auVar52,auVar235);
      auVar42 = vfmadd231ps_fma(auVar235,auVar41,auVar56);
      auVar248._8_8_ = auVar59._0_8_;
      auVar248._0_8_ = auVar59._0_8_;
      auVar52 = vshufpd_avx(auVar59,auVar59,3);
      auVar52 = vsubps_avx512vl(auVar52,auVar248);
      auVar52 = vfmadd213ps_avx512vl(auVar52,auVar41,auVar248);
      auVar121._0_8_ = auVar56._0_8_ ^ 0x8000000080000000;
      auVar121._8_4_ = auVar56._8_4_ ^ 0x80000000;
      auVar121._12_4_ = auVar56._12_4_ ^ 0x80000000;
      auVar41 = vmovshdup_avx512vl(auVar52);
      auVar249._0_8_ = auVar41._0_8_ ^ 0x8000000080000000;
      auVar249._8_4_ = auVar41._8_4_ ^ 0x80000000;
      auVar249._12_4_ = auVar41._12_4_ ^ 0x80000000;
      auVar59 = vmovshdup_avx512vl(auVar56);
      auVar62 = vpermt2ps_avx512vl(auVar249,ZEXT416(5),auVar56);
      auVar41 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar41._0_4_ * auVar56._0_4_)),auVar52,auVar59);
      auVar56 = vpermt2ps_avx512vl(auVar52,SUB6416(ZEXT464(4),0),auVar121);
      auVar147._0_4_ = auVar41._0_4_;
      auVar147._4_4_ = auVar147._0_4_;
      auVar147._8_4_ = auVar147._0_4_;
      auVar147._12_4_ = auVar147._0_4_;
      auVar52 = vdivps_avx(auVar62,auVar147);
      auVar48 = vdivps_avx512vl(auVar56,auVar147);
      fVar224 = auVar42._0_4_;
      auVar41 = vshufps_avx(auVar42,auVar42,0x55);
      auVar236._0_4_ = fVar224 * auVar52._0_4_ + auVar41._0_4_ * auVar48._0_4_;
      auVar236._4_4_ = fVar224 * auVar52._4_4_ + auVar41._4_4_ * auVar48._4_4_;
      auVar236._8_4_ = fVar224 * auVar52._8_4_ + auVar41._8_4_ * auVar48._8_4_;
      auVar236._12_4_ = fVar224 * auVar52._12_4_ + auVar41._12_4_ * auVar48._12_4_;
      auVar39 = vsubps_avx(auVar57,auVar236);
      auVar41 = vmovshdup_avx(auVar52);
      auVar57 = vinsertps_avx(auVar191,auVar228,0x1c);
      auVar250._0_4_ = auVar41._0_4_ * auVar57._0_4_;
      auVar250._4_4_ = auVar41._4_4_ * auVar57._4_4_;
      auVar250._8_4_ = auVar41._8_4_ * auVar57._8_4_;
      auVar250._12_4_ = auVar41._12_4_ * auVar57._12_4_;
      auVar63 = vinsertps_avx512f(auVar179,auVar213,0x1c);
      auVar41 = vmulps_avx512vl(auVar41,auVar63);
      auVar62 = vminps_avx512vl(auVar250,auVar41);
      auVar42 = vmaxps_avx(auVar41,auVar250);
      auVar59 = vmovshdup_avx(auVar48);
      auVar41 = vinsertps_avx(auVar228,auVar191,0x4c);
      auVar229._0_4_ = auVar59._0_4_ * auVar41._0_4_;
      auVar229._4_4_ = auVar59._4_4_ * auVar41._4_4_;
      auVar229._8_4_ = auVar59._8_4_ * auVar41._8_4_;
      auVar229._12_4_ = auVar59._12_4_ * auVar41._12_4_;
      auVar56 = vinsertps_avx(auVar213,auVar179,0x4c);
      auVar214._0_4_ = auVar59._0_4_ * auVar56._0_4_;
      auVar214._4_4_ = auVar59._4_4_ * auVar56._4_4_;
      auVar214._8_4_ = auVar59._8_4_ * auVar56._8_4_;
      auVar214._12_4_ = auVar59._12_4_ * auVar56._12_4_;
      auVar59 = vminps_avx(auVar229,auVar214);
      auVar62 = vaddps_avx512vl(auVar62,auVar59);
      auVar59 = vmaxps_avx(auVar214,auVar229);
      auVar215._0_4_ = auVar42._0_4_ + auVar59._0_4_;
      auVar215._4_4_ = auVar42._4_4_ + auVar59._4_4_;
      auVar215._8_4_ = auVar42._8_4_ + auVar59._8_4_;
      auVar215._12_4_ = auVar42._12_4_ + auVar59._12_4_;
      auVar230._8_8_ = 0x3f80000000000000;
      auVar230._0_8_ = 0x3f80000000000000;
      auVar42 = vsubps_avx(auVar230,auVar215);
      auVar59 = vsubps_avx(auVar230,auVar62);
      auVar62 = vsubps_avx(auVar55,auVar61);
      auVar61 = vsubps_avx(auVar47,auVar61);
      fVar221 = auVar62._0_4_;
      auVar251._0_4_ = fVar221 * auVar42._0_4_;
      fVar222 = auVar62._4_4_;
      auVar251._4_4_ = fVar222 * auVar42._4_4_;
      fVar223 = auVar62._8_4_;
      auVar251._8_4_ = fVar223 * auVar42._8_4_;
      fVar166 = auVar62._12_4_;
      auVar251._12_4_ = fVar166 * auVar42._12_4_;
      auVar49 = vbroadcastss_avx512vl(auVar52);
      auVar57 = vmulps_avx512vl(auVar49,auVar57);
      auVar63 = vmulps_avx512vl(auVar49,auVar63);
      auVar49 = vminps_avx512vl(auVar57,auVar63);
      auVar63 = vmaxps_avx512vl(auVar63,auVar57);
      auVar57 = vbroadcastss_avx512vl(auVar48);
      auVar41 = vmulps_avx512vl(auVar57,auVar41);
      auVar57 = vmulps_avx512vl(auVar57,auVar56);
      auVar56 = vminps_avx512vl(auVar41,auVar57);
      auVar56 = vaddps_avx512vl(auVar49,auVar56);
      auVar62 = vmulps_avx512vl(auVar62,auVar59);
      fVar224 = auVar61._0_4_;
      auVar216._0_4_ = fVar224 * auVar42._0_4_;
      fVar208 = auVar61._4_4_;
      auVar216._4_4_ = fVar208 * auVar42._4_4_;
      fVar219 = auVar61._8_4_;
      auVar216._8_4_ = fVar219 * auVar42._8_4_;
      fVar220 = auVar61._12_4_;
      auVar216._12_4_ = fVar220 * auVar42._12_4_;
      auVar231._0_4_ = fVar224 * auVar59._0_4_;
      auVar231._4_4_ = fVar208 * auVar59._4_4_;
      auVar231._8_4_ = fVar219 * auVar59._8_4_;
      auVar231._12_4_ = fVar220 * auVar59._12_4_;
      auVar57 = vmaxps_avx(auVar57,auVar41);
      auVar180._0_4_ = auVar63._0_4_ + auVar57._0_4_;
      auVar180._4_4_ = auVar63._4_4_ + auVar57._4_4_;
      auVar180._8_4_ = auVar63._8_4_ + auVar57._8_4_;
      auVar180._12_4_ = auVar63._12_4_ + auVar57._12_4_;
      auVar192._8_8_ = 0x3f800000;
      auVar192._0_8_ = 0x3f800000;
      auVar57 = vsubps_avx(auVar192,auVar180);
      auVar41 = vsubps_avx512vl(auVar192,auVar56);
      auVar243._0_4_ = fVar221 * auVar57._0_4_;
      auVar243._4_4_ = fVar222 * auVar57._4_4_;
      auVar243._8_4_ = fVar223 * auVar57._8_4_;
      auVar243._12_4_ = fVar166 * auVar57._12_4_;
      auVar237._0_4_ = fVar221 * auVar41._0_4_;
      auVar237._4_4_ = fVar222 * auVar41._4_4_;
      auVar237._8_4_ = fVar223 * auVar41._8_4_;
      auVar237._12_4_ = fVar166 * auVar41._12_4_;
      auVar181._0_4_ = fVar224 * auVar57._0_4_;
      auVar181._4_4_ = fVar208 * auVar57._4_4_;
      auVar181._8_4_ = fVar219 * auVar57._8_4_;
      auVar181._12_4_ = fVar220 * auVar57._12_4_;
      auVar193._0_4_ = fVar224 * auVar41._0_4_;
      auVar193._4_4_ = fVar208 * auVar41._4_4_;
      auVar193._8_4_ = fVar219 * auVar41._8_4_;
      auVar193._12_4_ = fVar220 * auVar41._12_4_;
      auVar57 = vminps_avx(auVar243,auVar237);
      auVar41 = vminps_avx512vl(auVar181,auVar193);
      auVar56 = vminps_avx512vl(auVar57,auVar41);
      auVar57 = vmaxps_avx(auVar237,auVar243);
      auVar41 = vmaxps_avx(auVar193,auVar181);
      auVar41 = vmaxps_avx(auVar41,auVar57);
      auVar42 = vminps_avx512vl(auVar251,auVar62);
      auVar57 = vminps_avx(auVar216,auVar231);
      auVar57 = vminps_avx(auVar42,auVar57);
      auVar57 = vhaddps_avx(auVar56,auVar57);
      auVar83._0_16_ = vmaxps_avx512vl(auVar62,auVar251);
      auVar56 = vmaxps_avx(auVar231,auVar216);
      auVar56 = vmaxps_avx(auVar56,auVar83._0_16_);
      auVar41 = vhaddps_avx(auVar41,auVar56);
      auVar57 = vshufps_avx(auVar57,auVar57,0xe8);
      auVar41 = vshufps_avx(auVar41,auVar41,0xe8);
      auVar182._0_4_ = auVar57._0_4_ + auVar39._0_4_;
      auVar182._4_4_ = auVar57._4_4_ + auVar39._4_4_;
      auVar182._8_4_ = auVar57._8_4_ + auVar39._8_4_;
      auVar182._12_4_ = auVar57._12_4_ + auVar39._12_4_;
      auVar194._0_4_ = auVar41._0_4_ + auVar39._0_4_;
      auVar194._4_4_ = auVar41._4_4_ + auVar39._4_4_;
      auVar194._8_4_ = auVar41._8_4_ + auVar39._8_4_;
      auVar194._12_4_ = auVar41._12_4_ + auVar39._12_4_;
      auVar57 = vmaxps_avx(auVar55,auVar182);
      auVar41 = vminps_avx(auVar194,auVar47);
      uVar2 = vcmpps_avx512vl(auVar41,auVar57,1);
    } while ((uVar2 & 3) != 0);
    uVar2 = vcmpps_avx512vl(auVar194,auVar47,1);
    uVar14 = vcmpps_avx512vl(auVar43,auVar182,1);
    if (((ushort)uVar14 & (ushort)uVar2 & 1) == 0) {
      bVar24 = 0;
    }
    else {
      auVar57 = vmovshdup_avx(auVar182);
      bVar24 = auVar45._0_4_ < auVar57._0_4_ & (byte)(uVar2 >> 1) & 0x7f;
    }
    if (((3 < (uint)uVar26 || uVar7 != 0 && !bVar36) | bVar24) == 1) {
      lVar28 = 200;
      do {
        auVar43 = vsubss_avx512f(auVar60,auVar39);
        fVar219 = auVar43._0_4_;
        fVar224 = fVar219 * fVar219 * fVar219;
        auVar43 = vmulss_avx512f(auVar39,ZEXT416(0x40400000));
        fVar208 = auVar43._0_4_ * fVar219 * fVar219;
        fVar220 = auVar39._0_4_;
        auVar43 = vmulss_avx512f(ZEXT416((uint)(fVar220 * fVar220)),ZEXT416(0x40400000));
        fVar219 = fVar219 * auVar43._0_4_;
        auVar135._4_4_ = fVar224;
        auVar135._0_4_ = fVar224;
        auVar135._8_4_ = fVar224;
        auVar135._12_4_ = fVar224;
        auVar127._4_4_ = fVar208;
        auVar127._0_4_ = fVar208;
        auVar127._8_4_ = fVar208;
        auVar127._12_4_ = fVar208;
        auVar108._4_4_ = fVar219;
        auVar108._0_4_ = fVar219;
        auVar108._8_4_ = fVar219;
        auVar108._12_4_ = fVar219;
        fVar220 = fVar220 * fVar220 * fVar220;
        auVar163._0_4_ = (float)local_c8._0_4_ * fVar220;
        auVar163._4_4_ = (float)local_c8._4_4_ * fVar220;
        auVar163._8_4_ = fStack_c0 * fVar220;
        auVar163._12_4_ = fStack_bc * fVar220;
        auVar43 = vfmadd231ps_fma(auVar163,local_1a8,auVar108);
        auVar43 = vfmadd231ps_fma(auVar43,local_198,auVar127);
        auVar43 = vfmadd231ps_fma(auVar43,local_318,auVar135);
        auVar109._8_8_ = auVar43._0_8_;
        auVar109._0_8_ = auVar43._0_8_;
        auVar43 = vshufpd_avx(auVar43,auVar43,3);
        auVar57 = vshufps_avx(auVar39,auVar39,0x55);
        auVar43 = vsubps_avx(auVar43,auVar109);
        auVar57 = vfmadd213ps_fma(auVar43,auVar57,auVar109);
        fVar224 = auVar57._0_4_;
        auVar43 = vshufps_avx(auVar57,auVar57,0x55);
        auVar110._0_4_ = auVar52._0_4_ * fVar224 + auVar48._0_4_ * auVar43._0_4_;
        auVar110._4_4_ = auVar52._4_4_ * fVar224 + auVar48._4_4_ * auVar43._4_4_;
        auVar110._8_4_ = auVar52._8_4_ * fVar224 + auVar48._8_4_ * auVar43._8_4_;
        auVar110._12_4_ = auVar52._12_4_ * fVar224 + auVar48._12_4_ * auVar43._12_4_;
        auVar39 = vsubps_avx(auVar39,auVar110);
        auVar43 = vandps_avx512vl(auVar57,auVar255._0_16_);
        auVar83._0_16_ = vprolq_avx512vl(auVar43,0x20);
        auVar43 = vmaxss_avx(auVar83._0_16_,auVar43);
        bVar36 = auVar43._0_4_ <= (float)local_278._0_4_;
        if (auVar43._0_4_ < (float)local_278._0_4_) {
          auVar43 = vucomiss_avx512f(auVar40);
          if (bVar36) {
            auVar52 = vucomiss_avx512f(auVar43);
            auVar257 = ZEXT1664(auVar52);
            if (bVar36) {
              vmovshdup_avx(auVar43);
              auVar52 = vucomiss_avx512f(auVar40);
              if (bVar36) {
                auVar57 = vucomiss_avx512f(auVar52);
                auVar257 = ZEXT1664(auVar57);
                if (bVar36) {
                  auVar41 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
                  auVar61 = vinsertps_avx(auVar41,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2])
                                          ,0x28);
                  aVar3 = (ray->super_RayK<1>).org.field_0;
                  auVar41 = vsubps_avx(local_1b8,(undefined1  [16])aVar3);
                  auVar41 = vdpps_avx(auVar41,auVar61,0x7f);
                  auVar55 = vsubps_avx(local_1c8,(undefined1  [16])aVar3);
                  auVar55 = vdpps_avx(auVar55,auVar61,0x7f);
                  auVar56 = vsubps_avx(local_1d8,(undefined1  [16])aVar3);
                  auVar56 = vdpps_avx(auVar56,auVar61,0x7f);
                  auVar42 = vsubps_avx(local_1e8,(undefined1  [16])aVar3);
                  auVar42 = vdpps_avx(auVar42,auVar61,0x7f);
                  auVar59 = vsubps_avx(_local_1f8,(undefined1  [16])aVar3);
                  auVar59 = vdpps_avx(auVar59,auVar61,0x7f);
                  auVar60 = vsubps_avx(_local_208,(undefined1  [16])aVar3);
                  auVar60 = vdpps_avx(auVar60,auVar61,0x7f);
                  auVar62 = vsubps_avx(_local_218,(undefined1  [16])aVar3);
                  auVar62 = vdpps_avx(auVar62,auVar61,0x7f);
                  auVar39 = vsubps_avx(_local_228,(undefined1  [16])aVar3);
                  auVar61 = vdpps_avx(auVar39,auVar61,0x7f);
                  auVar39 = vsubss_avx512f(auVar57,auVar52);
                  fVar224 = auVar52._0_4_;
                  auVar52 = vfmadd231ss_fma(ZEXT416((uint)(auVar59._0_4_ * fVar224)),auVar39,auVar41
                                           );
                  auVar41 = vfmadd231ss_fma(ZEXT416((uint)(auVar60._0_4_ * fVar224)),auVar39,auVar55
                                           );
                  auVar55 = vfmadd231ss_fma(ZEXT416((uint)(auVar62._0_4_ * fVar224)),auVar39,auVar56
                                           );
                  auVar56 = vfmadd231ss_fma(ZEXT416((uint)(fVar224 * auVar61._0_4_)),auVar39,auVar42
                                           );
                  auVar57 = vsubss_avx512f(auVar57,auVar43);
                  auVar164._0_4_ = auVar57._0_4_;
                  fVar208 = auVar164._0_4_ * auVar164._0_4_ * auVar164._0_4_;
                  auVar57 = vmulss_avx512f(auVar43,ZEXT416(0x40400000));
                  fVar219 = auVar57._0_4_ * auVar164._0_4_ * auVar164._0_4_;
                  fVar224 = auVar43._0_4_;
                  auVar148._0_4_ = fVar224 * fVar224;
                  auVar148._4_4_ = auVar43._4_4_ * auVar43._4_4_;
                  auVar148._8_4_ = auVar43._8_4_ * auVar43._8_4_;
                  auVar148._12_4_ = auVar43._12_4_ * auVar43._12_4_;
                  auVar83._0_16_ = vmulss_avx512f(auVar148,ZEXT416(0x40400000));
                  fVar220 = auVar164._0_4_ * auVar83._0_4_;
                  fVar222 = fVar224 * auVar148._0_4_;
                  auVar57 = vfmadd231ss_fma(ZEXT416((uint)(fVar222 * auVar56._0_4_)),
                                            ZEXT416((uint)fVar220),auVar55);
                  auVar57 = vfmadd231ss_fma(auVar57,ZEXT416((uint)fVar219),auVar41);
                  auVar52 = vfmadd231ss_fma(auVar57,ZEXT416((uint)fVar208),auVar52);
                  fVar221 = auVar52._0_4_;
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar221) &&
                     (fVar223 = (ray->super_RayK<1>).tfar, fVar221 <= fVar223)) {
                    auVar52 = vshufps_avx(auVar43,auVar43,0x55);
                    auVar41 = vsubps_avx512vl(auVar44,auVar52);
                    fVar166 = auVar52._0_4_;
                    auVar195._0_4_ = fVar166 * (float)local_1f8._0_4_;
                    fVar175 = auVar52._4_4_;
                    auVar195._4_4_ = fVar175 * (float)local_1f8._4_4_;
                    fVar183 = auVar52._8_4_;
                    auVar195._8_4_ = fVar183 * fStack_1f0;
                    fVar197 = auVar52._12_4_;
                    auVar195._12_4_ = fVar197 * fStack_1ec;
                    auVar205._0_4_ = fVar166 * (float)local_208._0_4_;
                    auVar205._4_4_ = fVar175 * (float)local_208._4_4_;
                    auVar205._8_4_ = fVar183 * fStack_200;
                    auVar205._12_4_ = fVar197 * fStack_1fc;
                    auVar217._0_4_ = fVar166 * (float)local_218._0_4_;
                    auVar217._4_4_ = fVar175 * (float)local_218._4_4_;
                    auVar217._8_4_ = fVar183 * fStack_210;
                    auVar217._12_4_ = fVar197 * fStack_20c;
                    auVar172._0_4_ = fVar166 * (float)local_228._0_4_;
                    auVar172._4_4_ = fVar175 * (float)local_228._4_4_;
                    auVar172._8_4_ = fVar183 * fStack_220;
                    auVar172._12_4_ = fVar197 * fStack_21c;
                    auVar44 = vfmadd231ps_fma(auVar195,auVar41,local_1b8);
                    auVar52 = vfmadd231ps_fma(auVar205,auVar41,local_1c8);
                    auVar57 = vfmadd231ps_fma(auVar217,auVar41,local_1d8);
                    auVar41 = vfmadd231ps_fma(auVar172,auVar41,local_1e8);
                    auVar44 = vsubps_avx(auVar52,auVar44);
                    auVar52 = vsubps_avx(auVar57,auVar52);
                    auVar57 = vsubps_avx(auVar41,auVar57);
                    auVar218._0_4_ = fVar224 * auVar52._0_4_;
                    auVar218._4_4_ = fVar224 * auVar52._4_4_;
                    auVar218._8_4_ = fVar224 * auVar52._8_4_;
                    auVar218._12_4_ = fVar224 * auVar52._12_4_;
                    auVar164._4_4_ = auVar164._0_4_;
                    auVar164._8_4_ = auVar164._0_4_;
                    auVar164._12_4_ = auVar164._0_4_;
                    auVar44 = vfmadd231ps_fma(auVar218,auVar164,auVar44);
                    auVar173._0_4_ = fVar224 * auVar57._0_4_;
                    auVar173._4_4_ = fVar224 * auVar57._4_4_;
                    auVar173._8_4_ = fVar224 * auVar57._8_4_;
                    auVar173._12_4_ = fVar224 * auVar57._12_4_;
                    auVar52 = vfmadd231ps_fma(auVar173,auVar164,auVar52);
                    auVar174._0_4_ = fVar224 * auVar52._0_4_;
                    auVar174._4_4_ = fVar224 * auVar52._4_4_;
                    auVar174._8_4_ = fVar224 * auVar52._8_4_;
                    auVar174._12_4_ = fVar224 * auVar52._12_4_;
                    auVar44 = vfmadd231ps_fma(auVar174,auVar164,auVar44);
                    auVar19._8_4_ = 0x40400000;
                    auVar19._0_8_ = 0x4040000040400000;
                    auVar19._12_4_ = 0x40400000;
                    auVar83._0_16_ = vmulps_avx512vl(auVar44,auVar19);
                    pGVar8 = (context->scene->geometries).items[uVar32].ptr;
                    if ((pGVar8->mask & (ray->super_RayK<1>).mask) != 0) {
                      auVar149._0_4_ = fVar222 * (float)local_138._0_4_;
                      auVar149._4_4_ = fVar222 * (float)local_138._4_4_;
                      auVar149._8_4_ = fVar222 * fStack_130;
                      auVar149._12_4_ = fVar222 * fStack_12c;
                      auVar136._4_4_ = fVar220;
                      auVar136._0_4_ = fVar220;
                      auVar136._8_4_ = fVar220;
                      auVar136._12_4_ = fVar220;
                      auVar44 = vfmadd132ps_fma(auVar136,auVar149,local_128);
                      auVar128._4_4_ = fVar219;
                      auVar128._0_4_ = fVar219;
                      auVar128._8_4_ = fVar219;
                      auVar128._12_4_ = fVar219;
                      auVar44 = vfmadd132ps_fma(auVar128,auVar44,local_118);
                      auVar122._4_4_ = fVar208;
                      auVar122._0_4_ = fVar208;
                      auVar122._8_4_ = fVar208;
                      auVar122._12_4_ = fVar208;
                      auVar57 = vfmadd132ps_fma(auVar122,auVar44,local_108);
                      auVar44 = vshufps_avx(auVar57,auVar57,0xc9);
                      auVar52 = vshufps_avx(auVar83._0_16_,auVar83._0_16_,0xc9);
                      auVar123._0_4_ = auVar57._0_4_ * auVar52._0_4_;
                      auVar123._4_4_ = auVar57._4_4_ * auVar52._4_4_;
                      auVar123._8_4_ = auVar57._8_4_ * auVar52._8_4_;
                      auVar123._12_4_ = auVar57._12_4_ * auVar52._12_4_;
                      auVar44 = vfmsub231ps_fma(auVar123,auVar83._0_16_,auVar44);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar221;
                        auVar40 = vshufps_avx(auVar44,auVar44,0xe9);
                        uVar14 = vmovlps_avx(auVar40);
                        *(undefined8 *)&(ray->Ng).field_0 = uVar14;
                        (ray->Ng).field_0.field_0.z = auVar44._0_4_;
                        uVar14 = vmovlps_avx(auVar43);
                        ray->u = (float)(int)uVar14;
                        ray->v = (float)(int)((ulong)uVar14 >> 0x20);
                        ray->primID = (uint)local_300;
                        ray->geomID = uVar32;
                        ray->instID[0] = context->user->instID[0];
                        ray->instPrimID[0] = context->user->instPrimID[0];
                      }
                      else {
                        auVar52 = vshufps_avx(auVar44,auVar44,0xe9);
                        local_178 = vmovlps_avx(auVar52);
                        local_170 = auVar44._0_4_;
                        local_16c = vmovlps_avx(auVar43);
                        local_164 = (uint)local_300;
                        local_160 = uVar32;
                        local_15c = context->user->instID[0];
                        local_158 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar221;
                        local_31c = -1;
                        local_258.valid = &local_31c;
                        local_258.geometryUserPtr = pGVar8->userPtr;
                        local_258.context = context->user;
                        local_258.ray = (RTCRayN *)ray;
                        local_258.hit = (RTCHitN *)&local_178;
                        local_258.N = 1;
                        if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01bc17fb:
                          auVar43 = auVar258._0_16_;
                          p_Var13 = context->args->filter;
                          if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var13)(&local_258);
                            in_ZMM23 = ZEXT3264(_DAT_01feed20);
                            auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar253 = ZEXT1664(auVar44);
                            auVar83 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar252 = ZEXT3264(auVar83);
                            auVar257 = ZEXT464(0x3f800000);
                            auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                            auVar254 = ZEXT1664(auVar44);
                            auVar43 = vxorps_avx512vl(auVar43,auVar43);
                            auVar258 = ZEXT1664(auVar43);
                            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar256 = ZEXT1664(auVar43);
                            auVar83._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar255 = ZEXT1664(auVar83._0_16_);
                            if (*local_258.valid == 0) goto LAB_01bc1918;
                          }
                          (((Vec3f *)((long)local_258.ray + 0x30))->field_0).components[0] =
                               *(float *)local_258.hit;
                          (((Vec3f *)((long)local_258.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_258.hit + 4);
                          (((Vec3f *)((long)local_258.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_258.hit + 8);
                          *(float *)((long)local_258.ray + 0x3c) = *(float *)(local_258.hit + 0xc);
                          *(float *)((long)local_258.ray + 0x40) = *(float *)(local_258.hit + 0x10);
                          *(float *)((long)local_258.ray + 0x44) = *(float *)(local_258.hit + 0x14);
                          *(float *)((long)local_258.ray + 0x48) = *(float *)(local_258.hit + 0x18);
                          *(float *)((long)local_258.ray + 0x4c) = *(float *)(local_258.hit + 0x1c);
                          *(float *)((long)local_258.ray + 0x50) = *(float *)(local_258.hit + 0x20);
                        }
                        else {
                          local_268 = lVar33;
                          (*pGVar8->intersectionFilterN)(&local_258);
                          in_ZMM23 = ZEXT3264(_DAT_01feed20);
                          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                          auVar253 = ZEXT1664(auVar43);
                          auVar83 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar252 = ZEXT3264(auVar83);
                          auVar257 = ZEXT464(0x3f800000);
                          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                          auVar254 = ZEXT1664(auVar43);
                          auVar43 = vxorps_avx512vl(auVar40,auVar40);
                          auVar258 = ZEXT1664(auVar43);
                          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar256 = ZEXT1664(auVar43);
                          auVar83._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar255 = ZEXT1664(auVar83._0_16_);
                          lVar33 = local_268;
                          if (*local_258.valid != 0) goto LAB_01bc17fb;
LAB_01bc1918:
                          auVar257 = ZEXT464(0x3f800000);
                          (ray->super_RayK<1>).tfar = fVar223;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          break;
        }
        lVar28 = lVar28 + -1;
      } while (lVar28 != 0);
      goto LAB_01bc0ac8;
    }
    auVar114 = vinsertps_avx(auVar45,auVar46,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }